

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::sse2::CurveNiMBIntersector1<4>::
     intersect_t<embree::sse2::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::sse2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  Primitive *pPVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  Primitive PVar18;
  Geometry *pGVar19;
  __int_type_conflict _Var20;
  long lVar21;
  long lVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined8 uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined6 uVar43;
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  undefined1 auVar51 [12];
  undefined1 auVar52 [12];
  undefined1 auVar53 [12];
  undefined1 auVar54 [12];
  undefined1 auVar55 [12];
  undefined1 auVar56 [12];
  undefined1 auVar57 [12];
  undefined1 auVar58 [12];
  undefined1 auVar59 [12];
  undefined1 auVar60 [12];
  undefined1 auVar61 [12];
  undefined1 auVar62 [12];
  undefined1 auVar63 [12];
  undefined1 auVar64 [12];
  int iVar65;
  undefined4 uVar66;
  ulong uVar67;
  ulong uVar68;
  RayHit *extraout_RAX;
  RayHit *extraout_RAX_00;
  RayHit *extraout_RAX_01;
  RayHit *extraout_RAX_02;
  RayHit *pRVar69;
  undefined4 uVar71;
  RayHit *extraout_RAX_03;
  RayHit *extraout_RAX_04;
  RayHit *extraout_RAX_05;
  RayHit *extraout_RAX_06;
  RayHit *pRVar70;
  RTCIntersectArguments *pRVar72;
  ulong uVar73;
  long lVar74;
  ulong uVar75;
  long lVar76;
  long lVar77;
  bool bVar78;
  uint uVar79;
  uint uVar80;
  uint uVar81;
  uint uVar82;
  short sVar83;
  undefined2 uVar121;
  float fVar84;
  uint uVar85;
  float fVar122;
  float fVar124;
  __m128 a_1;
  uint uVar123;
  uint uVar125;
  uint uVar126;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar90 [16];
  undefined1 auVar93 [16];
  undefined1 auVar96 [16];
  undefined1 auVar99 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar127;
  float fVar151;
  float fVar152;
  undefined1 auVar128 [16];
  undefined1 auVar131 [16];
  undefined1 auVar134 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  float fVar153;
  float fVar167;
  float fVar168;
  vfloat4 v;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  float fVar169;
  float fVar187;
  float fVar188;
  vfloat4 v_1;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  float fVar189;
  float fVar206;
  float fVar207;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  float fVar208;
  float fVar230;
  float fVar231;
  undefined1 auVar209 [16];
  undefined1 auVar212 [16];
  undefined1 auVar215 [16];
  undefined1 auVar218 [16];
  undefined1 auVar221 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  float fVar232;
  float fVar238;
  float fVar239;
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  float fVar240;
  float fVar241;
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  float fVar242;
  float fVar252;
  float fVar253;
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  float fVar254;
  float fVar259;
  float fVar260;
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  float fVar261;
  float fVar271;
  float fVar272;
  undefined1 auVar262 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  float fVar273;
  float fVar280;
  float fVar281;
  undefined1 auVar274 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  float fVar282;
  float fVar289;
  float fVar290;
  float fVar291;
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  float fVar292;
  float fVar299;
  float fVar300;
  float fVar301;
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  float fVar302;
  float fVar303;
  float fVar310;
  float fVar311;
  vfloat4 a;
  float fVar312;
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar307 [16];
  undefined1 auVar309 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  RTCFilterFunctionNArguments args;
  vfloatx vu0;
  vfloatx u_outer1;
  vfloatx u_outer0;
  BBox<embree::vfloat_impl<4>_> tp1;
  BBox<embree::vfloat_impl<4>_> tp0;
  StackEntry stack [4];
  undefined1 local_5e8 [8];
  float fStack_5e0;
  float fStack_5dc;
  undefined4 local_5ac;
  float local_5a8;
  float fStack_5a4;
  float fStack_5a0;
  float fStack_59c;
  float local_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  undefined1 local_588 [8];
  float fStack_580;
  float fStack_57c;
  RTCIntersectArguments *local_570;
  undefined1 local_568 [16];
  undefined1 local_558 [16];
  undefined1 local_548 [8];
  float fStack_540;
  float fStack_53c;
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  ulong local_520;
  undefined1 local_518 [8];
  float fStack_510;
  float fStack_50c;
  undefined1 local_508 [8];
  float fStack_500;
  float fStack_4fc;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  RTCFilterFunctionNArguments local_4c8;
  ulong local_490;
  undefined1 local_488 [8];
  float fStack_480;
  float fStack_47c;
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  undefined8 local_458;
  float fStack_450;
  float fStack_44c;
  undefined4 local_448;
  uint local_444;
  uint local_440;
  uint local_43c;
  uint local_438;
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  float local_408;
  float fStack_404;
  undefined4 uStack_400;
  undefined4 uStack_3fc;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [16];
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  undefined4 uStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  undefined1 local_308 [16];
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [16];
  float local_2d8 [4];
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  Primitive *local_2b8;
  ulong local_2b0;
  uint local_2a8;
  uint uStack_2a4;
  uint uStack_2a0;
  uint uStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [16];
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [16];
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [8];
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [16];
  uint auStack_f8 [4];
  float afStack_e8 [6];
  float afStack_d0 [40];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 uVar120;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar159 [16];
  undefined1 auVar162 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar306 [16];
  undefined1 auVar308 [16];
  
  PVar18 = prim[1];
  uVar67 = (ulong)(byte)PVar18;
  lVar77 = uVar67 * 0x25;
  pPVar9 = prim + lVar77 + 6;
  fVar168 = *(float *)(pPVar9 + 0xc);
  fVar169 = ((ray->super_RayK<1>).org.field_0.m128[0] - *(float *)pPVar9) * fVar168;
  fVar187 = ((ray->super_RayK<1>).org.field_0.m128[1] - *(float *)(pPVar9 + 4)) * fVar168;
  fVar188 = ((ray->super_RayK<1>).org.field_0.m128[2] - *(float *)(pPVar9 + 8)) * fVar168;
  fVar153 = fVar168 * (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar167 = fVar168 * (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar168 = fVar168 * (ray->super_RayK<1>).dir.field_0.m128[2];
  uVar71 = *(undefined4 *)(prim + uVar67 * 4 + 6);
  uVar120 = (undefined1)((uint)uVar71 >> 0x18);
  uVar121 = CONCAT11(uVar120,uVar120);
  uVar120 = (undefined1)((uint)uVar71 >> 0x10);
  uVar30 = CONCAT35(CONCAT21(uVar121,uVar120),CONCAT14(uVar120,uVar71));
  uVar120 = (undefined1)((uint)uVar71 >> 8);
  uVar43 = CONCAT51(CONCAT41((int)((ulong)uVar30 >> 0x20),uVar120),uVar120);
  sVar83 = CONCAT11((char)uVar71,(char)uVar71);
  uVar68 = CONCAT62(uVar43,sVar83);
  auVar266._8_4_ = 0;
  auVar266._0_8_ = uVar68;
  auVar266._12_2_ = uVar121;
  auVar266._14_2_ = uVar121;
  uVar121 = (undefined2)((ulong)uVar30 >> 0x20);
  auVar86._12_4_ = auVar266._12_4_;
  auVar86._8_2_ = 0;
  auVar86._0_8_ = uVar68;
  auVar86._10_2_ = uVar121;
  auVar155._10_6_ = auVar86._10_6_;
  auVar155._8_2_ = uVar121;
  auVar155._0_8_ = uVar68;
  uVar121 = (undefined2)uVar43;
  auVar44._4_8_ = auVar155._8_8_;
  auVar44._2_2_ = uVar121;
  auVar44._0_2_ = uVar121;
  fVar302 = (float)((int)sVar83 >> 8);
  fVar310 = (float)(auVar44._0_4_ >> 0x18);
  fVar311 = (float)(auVar155._8_4_ >> 0x18);
  uVar71 = *(undefined4 *)(prim + uVar67 * 5 + 6);
  uVar120 = (undefined1)((uint)uVar71 >> 0x18);
  uVar121 = CONCAT11(uVar120,uVar120);
  uVar120 = (undefined1)((uint)uVar71 >> 0x10);
  uVar30 = CONCAT35(CONCAT21(uVar121,uVar120),CONCAT14(uVar120,uVar71));
  uVar120 = (undefined1)((uint)uVar71 >> 8);
  uVar43 = CONCAT51(CONCAT41((int)((ulong)uVar30 >> 0x20),uVar120),uVar120);
  sVar83 = CONCAT11((char)uVar71,(char)uVar71);
  uVar68 = CONCAT62(uVar43,sVar83);
  auVar130._8_4_ = 0;
  auVar130._0_8_ = uVar68;
  auVar130._12_2_ = uVar121;
  auVar130._14_2_ = uVar121;
  uVar121 = (undefined2)((ulong)uVar30 >> 0x20);
  auVar129._12_4_ = auVar130._12_4_;
  auVar129._8_2_ = 0;
  auVar129._0_8_ = uVar68;
  auVar129._10_2_ = uVar121;
  auVar128._10_6_ = auVar129._10_6_;
  auVar128._8_2_ = uVar121;
  auVar128._0_8_ = uVar68;
  uVar121 = (undefined2)uVar43;
  auVar45._4_8_ = auVar128._8_8_;
  auVar45._2_2_ = uVar121;
  auVar45._0_2_ = uVar121;
  fVar189 = (float)((int)sVar83 >> 8);
  fVar206 = (float)(auVar45._0_4_ >> 0x18);
  fVar207 = (float)(auVar128._8_4_ >> 0x18);
  uVar71 = *(undefined4 *)(prim + uVar67 * 6 + 6);
  uVar120 = (undefined1)((uint)uVar71 >> 0x18);
  uVar121 = CONCAT11(uVar120,uVar120);
  uVar120 = (undefined1)((uint)uVar71 >> 0x10);
  uVar30 = CONCAT35(CONCAT21(uVar121,uVar120),CONCAT14(uVar120,uVar71));
  uVar120 = (undefined1)((uint)uVar71 >> 8);
  uVar43 = CONCAT51(CONCAT41((int)((ulong)uVar30 >> 0x20),uVar120),uVar120);
  sVar83 = CONCAT11((char)uVar71,(char)uVar71);
  uVar68 = CONCAT62(uVar43,sVar83);
  auVar133._8_4_ = 0;
  auVar133._0_8_ = uVar68;
  auVar133._12_2_ = uVar121;
  auVar133._14_2_ = uVar121;
  uVar121 = (undefined2)((ulong)uVar30 >> 0x20);
  auVar132._12_4_ = auVar133._12_4_;
  auVar132._8_2_ = 0;
  auVar132._0_8_ = uVar68;
  auVar132._10_2_ = uVar121;
  auVar131._10_6_ = auVar132._10_6_;
  auVar131._8_2_ = uVar121;
  auVar131._0_8_ = uVar68;
  uVar121 = (undefined2)uVar43;
  auVar46._4_8_ = auVar131._8_8_;
  auVar46._2_2_ = uVar121;
  auVar46._0_2_ = uVar121;
  fVar232 = (float)((int)sVar83 >> 8);
  fVar238 = (float)(auVar46._0_4_ >> 0x18);
  fVar239 = (float)(auVar131._8_4_ >> 0x18);
  uVar71 = *(undefined4 *)(prim + uVar67 * 0xf + 6);
  uVar120 = (undefined1)((uint)uVar71 >> 0x18);
  uVar121 = CONCAT11(uVar120,uVar120);
  uVar120 = (undefined1)((uint)uVar71 >> 0x10);
  uVar30 = CONCAT35(CONCAT21(uVar121,uVar120),CONCAT14(uVar120,uVar71));
  uVar120 = (undefined1)((uint)uVar71 >> 8);
  uVar43 = CONCAT51(CONCAT41((int)((ulong)uVar30 >> 0x20),uVar120),uVar120);
  sVar83 = CONCAT11((char)uVar71,(char)uVar71);
  uVar68 = CONCAT62(uVar43,sVar83);
  auVar136._8_4_ = 0;
  auVar136._0_8_ = uVar68;
  auVar136._12_2_ = uVar121;
  auVar136._14_2_ = uVar121;
  uVar121 = (undefined2)((ulong)uVar30 >> 0x20);
  auVar135._12_4_ = auVar136._12_4_;
  auVar135._8_2_ = 0;
  auVar135._0_8_ = uVar68;
  auVar135._10_2_ = uVar121;
  auVar134._10_6_ = auVar135._10_6_;
  auVar134._8_2_ = uVar121;
  auVar134._0_8_ = uVar68;
  uVar121 = (undefined2)uVar43;
  auVar47._4_8_ = auVar134._8_8_;
  auVar47._2_2_ = uVar121;
  auVar47._0_2_ = uVar121;
  fVar84 = (float)((int)sVar83 >> 8);
  fVar122 = (float)(auVar47._0_4_ >> 0x18);
  fVar124 = (float)(auVar134._8_4_ >> 0x18);
  uVar71 = *(undefined4 *)(prim + (ulong)(byte)PVar18 * 0x10 + 6);
  uVar120 = (undefined1)((uint)uVar71 >> 0x18);
  uVar121 = CONCAT11(uVar120,uVar120);
  uVar120 = (undefined1)((uint)uVar71 >> 0x10);
  uVar30 = CONCAT35(CONCAT21(uVar121,uVar120),CONCAT14(uVar120,uVar71));
  uVar120 = (undefined1)((uint)uVar71 >> 8);
  uVar43 = CONCAT51(CONCAT41((int)((ulong)uVar30 >> 0x20),uVar120),uVar120);
  sVar83 = CONCAT11((char)uVar71,(char)uVar71);
  uVar68 = CONCAT62(uVar43,sVar83);
  auVar211._8_4_ = 0;
  auVar211._0_8_ = uVar68;
  auVar211._12_2_ = uVar121;
  auVar211._14_2_ = uVar121;
  uVar121 = (undefined2)((ulong)uVar30 >> 0x20);
  auVar210._12_4_ = auVar211._12_4_;
  auVar210._8_2_ = 0;
  auVar210._0_8_ = uVar68;
  auVar210._10_2_ = uVar121;
  auVar209._10_6_ = auVar210._10_6_;
  auVar209._8_2_ = uVar121;
  auVar209._0_8_ = uVar68;
  uVar121 = (undefined2)uVar43;
  auVar48._4_8_ = auVar209._8_8_;
  auVar48._2_2_ = uVar121;
  auVar48._0_2_ = uVar121;
  fVar242 = (float)((int)sVar83 >> 8);
  fVar252 = (float)(auVar48._0_4_ >> 0x18);
  fVar253 = (float)(auVar209._8_4_ >> 0x18);
  uVar71 = *(undefined4 *)(prim + (ulong)(byte)PVar18 * 0x10 + uVar67 + 6);
  uVar120 = (undefined1)((uint)uVar71 >> 0x18);
  uVar121 = CONCAT11(uVar120,uVar120);
  uVar120 = (undefined1)((uint)uVar71 >> 0x10);
  uVar30 = CONCAT35(CONCAT21(uVar121,uVar120),CONCAT14(uVar120,uVar71));
  uVar120 = (undefined1)((uint)uVar71 >> 8);
  uVar43 = CONCAT51(CONCAT41((int)((ulong)uVar30 >> 0x20),uVar120),uVar120);
  sVar83 = CONCAT11((char)uVar71,(char)uVar71);
  uVar68 = CONCAT62(uVar43,sVar83);
  auVar214._8_4_ = 0;
  auVar214._0_8_ = uVar68;
  auVar214._12_2_ = uVar121;
  auVar214._14_2_ = uVar121;
  uVar121 = (undefined2)((ulong)uVar30 >> 0x20);
  auVar213._12_4_ = auVar214._12_4_;
  auVar213._8_2_ = 0;
  auVar213._0_8_ = uVar68;
  auVar213._10_2_ = uVar121;
  auVar212._10_6_ = auVar213._10_6_;
  auVar212._8_2_ = uVar121;
  auVar212._0_8_ = uVar68;
  uVar121 = (undefined2)uVar43;
  auVar49._4_8_ = auVar212._8_8_;
  auVar49._2_2_ = uVar121;
  auVar49._0_2_ = uVar121;
  fVar261 = (float)((int)sVar83 >> 8);
  fVar271 = (float)(auVar49._0_4_ >> 0x18);
  fVar272 = (float)(auVar212._8_4_ >> 0x18);
  uVar71 = *(undefined4 *)(prim + uVar67 * 0x1a + 6);
  uVar120 = (undefined1)((uint)uVar71 >> 0x18);
  uVar121 = CONCAT11(uVar120,uVar120);
  uVar120 = (undefined1)((uint)uVar71 >> 0x10);
  uVar30 = CONCAT35(CONCAT21(uVar121,uVar120),CONCAT14(uVar120,uVar71));
  uVar120 = (undefined1)((uint)uVar71 >> 8);
  uVar43 = CONCAT51(CONCAT41((int)((ulong)uVar30 >> 0x20),uVar120),uVar120);
  sVar83 = CONCAT11((char)uVar71,(char)uVar71);
  uVar68 = CONCAT62(uVar43,sVar83);
  auVar217._8_4_ = 0;
  auVar217._0_8_ = uVar68;
  auVar217._12_2_ = uVar121;
  auVar217._14_2_ = uVar121;
  uVar121 = (undefined2)((ulong)uVar30 >> 0x20);
  auVar216._12_4_ = auVar217._12_4_;
  auVar216._8_2_ = 0;
  auVar216._0_8_ = uVar68;
  auVar216._10_2_ = uVar121;
  auVar215._10_6_ = auVar216._10_6_;
  auVar215._8_2_ = uVar121;
  auVar215._0_8_ = uVar68;
  uVar121 = (undefined2)uVar43;
  auVar50._4_8_ = auVar215._8_8_;
  auVar50._2_2_ = uVar121;
  auVar50._0_2_ = uVar121;
  fVar254 = (float)((int)sVar83 >> 8);
  fVar259 = (float)(auVar50._0_4_ >> 0x18);
  fVar260 = (float)(auVar215._8_4_ >> 0x18);
  uVar71 = *(undefined4 *)(prim + uVar67 * 0x1b + 6);
  uVar120 = (undefined1)((uint)uVar71 >> 0x18);
  uVar121 = CONCAT11(uVar120,uVar120);
  uVar120 = (undefined1)((uint)uVar71 >> 0x10);
  uVar30 = CONCAT35(CONCAT21(uVar121,uVar120),CONCAT14(uVar120,uVar71));
  uVar120 = (undefined1)((uint)uVar71 >> 8);
  uVar43 = CONCAT51(CONCAT41((int)((ulong)uVar30 >> 0x20),uVar120),uVar120);
  sVar83 = CONCAT11((char)uVar71,(char)uVar71);
  uVar68 = CONCAT62(uVar43,sVar83);
  auVar220._8_4_ = 0;
  auVar220._0_8_ = uVar68;
  auVar220._12_2_ = uVar121;
  auVar220._14_2_ = uVar121;
  uVar121 = (undefined2)((ulong)uVar30 >> 0x20);
  auVar219._12_4_ = auVar220._12_4_;
  auVar219._8_2_ = 0;
  auVar219._0_8_ = uVar68;
  auVar219._10_2_ = uVar121;
  auVar218._10_6_ = auVar219._10_6_;
  auVar218._8_2_ = uVar121;
  auVar218._0_8_ = uVar68;
  uVar121 = (undefined2)uVar43;
  auVar51._4_8_ = auVar218._8_8_;
  auVar51._2_2_ = uVar121;
  auVar51._0_2_ = uVar121;
  fVar273 = (float)((int)sVar83 >> 8);
  fVar280 = (float)(auVar51._0_4_ >> 0x18);
  fVar281 = (float)(auVar218._8_4_ >> 0x18);
  uVar71 = *(undefined4 *)(prim + uVar67 * 0x1c + 6);
  uVar120 = (undefined1)((uint)uVar71 >> 0x18);
  uVar121 = CONCAT11(uVar120,uVar120);
  uVar120 = (undefined1)((uint)uVar71 >> 0x10);
  uVar30 = CONCAT35(CONCAT21(uVar121,uVar120),CONCAT14(uVar120,uVar71));
  uVar120 = (undefined1)((uint)uVar71 >> 8);
  uVar43 = CONCAT51(CONCAT41((int)((ulong)uVar30 >> 0x20),uVar120),uVar120);
  sVar83 = CONCAT11((char)uVar71,(char)uVar71);
  uVar68 = CONCAT62(uVar43,sVar83);
  auVar223._8_4_ = 0;
  auVar223._0_8_ = uVar68;
  auVar223._12_2_ = uVar121;
  auVar223._14_2_ = uVar121;
  uVar121 = (undefined2)((ulong)uVar30 >> 0x20);
  auVar222._12_4_ = auVar223._12_4_;
  auVar222._8_2_ = 0;
  auVar222._0_8_ = uVar68;
  auVar222._10_2_ = uVar121;
  auVar221._10_6_ = auVar222._10_6_;
  auVar221._8_2_ = uVar121;
  auVar221._0_8_ = uVar68;
  uVar121 = (undefined2)uVar43;
  auVar52._4_8_ = auVar221._8_8_;
  auVar52._2_2_ = uVar121;
  auVar52._0_2_ = uVar121;
  fVar127 = (float)((int)sVar83 >> 8);
  fVar151 = (float)(auVar52._0_4_ >> 0x18);
  fVar152 = (float)(auVar221._8_4_ >> 0x18);
  fVar292 = fVar153 * fVar302 + fVar167 * fVar189 + fVar168 * fVar232;
  fVar299 = fVar153 * fVar310 + fVar167 * fVar206 + fVar168 * fVar238;
  fVar300 = fVar153 * fVar311 + fVar167 * fVar207 + fVar168 * fVar239;
  fVar301 = fVar153 * (float)(auVar86._12_4_ >> 0x18) +
            fVar167 * (float)(auVar129._12_4_ >> 0x18) + fVar168 * (float)(auVar132._12_4_ >> 0x18);
  fVar282 = fVar153 * fVar84 + fVar167 * fVar242 + fVar168 * fVar261;
  fVar289 = fVar153 * fVar122 + fVar167 * fVar252 + fVar168 * fVar271;
  fVar290 = fVar153 * fVar124 + fVar167 * fVar253 + fVar168 * fVar272;
  fVar291 = fVar153 * (float)(auVar135._12_4_ >> 0x18) +
            fVar167 * (float)(auVar210._12_4_ >> 0x18) + fVar168 * (float)(auVar213._12_4_ >> 0x18);
  fVar208 = fVar153 * fVar254 + fVar167 * fVar273 + fVar168 * fVar127;
  fVar230 = fVar153 * fVar259 + fVar167 * fVar280 + fVar168 * fVar151;
  fVar231 = fVar153 * fVar260 + fVar167 * fVar281 + fVar168 * fVar152;
  fVar168 = fVar153 * (float)(auVar216._12_4_ >> 0x18) +
            fVar167 * (float)(auVar219._12_4_ >> 0x18) + fVar168 * (float)(auVar222._12_4_ >> 0x18);
  fVar303 = fVar302 * fVar169 + fVar189 * fVar187 + fVar232 * fVar188;
  fVar310 = fVar310 * fVar169 + fVar206 * fVar187 + fVar238 * fVar188;
  fVar311 = fVar311 * fVar169 + fVar207 * fVar187 + fVar239 * fVar188;
  fVar312 = (float)(auVar86._12_4_ >> 0x18) * fVar169 +
            (float)(auVar129._12_4_ >> 0x18) * fVar187 + (float)(auVar132._12_4_ >> 0x18) * fVar188;
  fVar261 = fVar84 * fVar169 + fVar242 * fVar187 + fVar261 * fVar188;
  fVar271 = fVar122 * fVar169 + fVar252 * fVar187 + fVar271 * fVar188;
  fVar272 = fVar124 * fVar169 + fVar253 * fVar187 + fVar272 * fVar188;
  fVar302 = (float)(auVar135._12_4_ >> 0x18) * fVar169 +
            (float)(auVar210._12_4_ >> 0x18) * fVar187 + (float)(auVar213._12_4_ >> 0x18) * fVar188;
  fVar254 = fVar169 * fVar254 + fVar187 * fVar273 + fVar188 * fVar127;
  fVar259 = fVar169 * fVar259 + fVar187 * fVar280 + fVar188 * fVar151;
  fVar260 = fVar169 * fVar260 + fVar187 * fVar281 + fVar188 * fVar152;
  fVar273 = fVar169 * (float)(auVar216._12_4_ >> 0x18) +
            fVar187 * (float)(auVar219._12_4_ >> 0x18) + fVar188 * (float)(auVar222._12_4_ >> 0x18);
  uVar85 = (uint)DAT_01fec6c0;
  uVar123 = DAT_01fec6c0._4_4_;
  uVar125 = DAT_01fec6c0._8_4_;
  uVar126 = DAT_01fec6c0._12_4_;
  uVar79 = -(uint)(1e-18 <= (float)((uint)fVar292 & uVar85));
  uVar80 = -(uint)(1e-18 <= (float)((uint)fVar299 & uVar123));
  uVar81 = -(uint)(1e-18 <= (float)((uint)fVar300 & uVar125));
  uVar82 = -(uint)(1e-18 <= (float)((uint)fVar301 & uVar126));
  auVar293._0_4_ = (uint)fVar292 & uVar79;
  auVar293._4_4_ = (uint)fVar299 & uVar80;
  auVar293._8_4_ = (uint)fVar300 & uVar81;
  auVar293._12_4_ = (uint)fVar301 & uVar82;
  auVar170._0_8_ = CONCAT44(~uVar80,~uVar79) & 0x219392ef219392ef;
  auVar170._8_4_ = ~uVar81 & 0x219392ef;
  auVar170._12_4_ = ~uVar82 & 0x219392ef;
  auVar170 = auVar170 | auVar293;
  uVar79 = -(uint)(1e-18 <= (float)((uint)fVar282 & uVar85));
  uVar80 = -(uint)(1e-18 <= (float)((uint)fVar289 & uVar123));
  uVar81 = -(uint)(1e-18 <= (float)((uint)fVar290 & uVar125));
  uVar82 = -(uint)(1e-18 <= (float)((uint)fVar291 & uVar126));
  auVar283._0_4_ = (uint)fVar282 & uVar79;
  auVar283._4_4_ = (uint)fVar289 & uVar80;
  auVar283._8_4_ = (uint)fVar290 & uVar81;
  auVar283._12_4_ = (uint)fVar291 & uVar82;
  auVar233._0_8_ = CONCAT44(~uVar80,~uVar79) & 0x219392ef219392ef;
  auVar233._8_4_ = ~uVar81 & 0x219392ef;
  auVar233._12_4_ = ~uVar82 & 0x219392ef;
  auVar233 = auVar233 | auVar283;
  uVar79 = -(uint)(1e-18 <= (float)((uint)fVar208 & uVar85));
  uVar80 = -(uint)(1e-18 <= (float)((uint)fVar230 & uVar123));
  uVar81 = -(uint)(1e-18 <= (float)((uint)fVar231 & uVar125));
  uVar82 = -(uint)(1e-18 <= (float)((uint)fVar168 & uVar126));
  auVar224._0_4_ = (uint)fVar208 & uVar79;
  auVar224._4_4_ = (uint)fVar230 & uVar80;
  auVar224._8_4_ = (uint)fVar231 & uVar81;
  auVar224._12_4_ = (uint)fVar168 & uVar82;
  auVar243._0_8_ = CONCAT44(~uVar80,~uVar79) & 0x219392ef219392ef;
  auVar243._8_4_ = ~uVar81 & 0x219392ef;
  auVar243._12_4_ = ~uVar82 & 0x219392ef;
  auVar243 = auVar243 | auVar224;
  auVar86 = rcpps(_DAT_01fec6c0,auVar170);
  fVar168 = auVar86._0_4_;
  fVar124 = auVar86._4_4_;
  fVar189 = auVar86._8_4_;
  fVar242 = auVar86._12_4_;
  fVar168 = (1.0 - auVar170._0_4_ * fVar168) * fVar168 + fVar168;
  fVar124 = (1.0 - auVar170._4_4_ * fVar124) * fVar124 + fVar124;
  fVar189 = (1.0 - auVar170._8_4_ * fVar189) * fVar189 + fVar189;
  fVar242 = (1.0 - auVar170._12_4_ * fVar242) * fVar242 + fVar242;
  auVar86 = rcpps(auVar86,auVar233);
  fVar84 = auVar86._0_4_;
  fVar127 = auVar86._4_4_;
  fVar206 = auVar86._8_4_;
  fVar252 = auVar86._12_4_;
  fVar84 = (1.0 - auVar233._0_4_ * fVar84) * fVar84 + fVar84;
  fVar127 = (1.0 - auVar233._4_4_ * fVar127) * fVar127 + fVar127;
  fVar206 = (1.0 - auVar233._8_4_ * fVar206) * fVar206 + fVar206;
  fVar252 = (1.0 - auVar233._12_4_ * fVar252) * fVar252 + fVar252;
  auVar86 = rcpps(auVar86,auVar243);
  fVar122 = auVar86._0_4_;
  fVar151 = auVar86._4_4_;
  fVar207 = auVar86._8_4_;
  fVar253 = auVar86._12_4_;
  fVar122 = (1.0 - auVar243._0_4_ * fVar122) * fVar122 + fVar122;
  fVar151 = (1.0 - auVar243._4_4_ * fVar151) * fVar151 + fVar151;
  fVar207 = (1.0 - auVar243._8_4_ * fVar207) * fVar207 + fVar207;
  fVar253 = (1.0 - auVar243._12_4_ * fVar253) * fVar253 + fVar253;
  fVar280 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar77 + 0x16)) *
            *(float *)(prim + lVar77 + 0x1a);
  uVar68 = *(ulong *)(prim + uVar67 * 7 + 6);
  uVar121 = (undefined2)(uVar68 >> 0x30);
  auVar156._8_4_ = 0;
  auVar156._0_8_ = uVar68;
  auVar156._12_2_ = uVar121;
  auVar156._14_2_ = uVar121;
  uVar121 = (undefined2)(uVar68 >> 0x20);
  auVar249._12_4_ = auVar156._12_4_;
  auVar249._8_2_ = 0;
  auVar249._0_8_ = uVar68;
  auVar249._10_2_ = uVar121;
  auVar256._10_6_ = auVar249._10_6_;
  auVar256._8_2_ = uVar121;
  auVar256._0_8_ = uVar68;
  uVar121 = (undefined2)(uVar68 >> 0x10);
  auVar53._4_8_ = auVar256._8_8_;
  auVar53._2_2_ = uVar121;
  auVar53._0_2_ = uVar121;
  fVar152 = (float)(auVar53._0_4_ >> 0x10);
  fVar208 = (float)(auVar256._8_4_ >> 0x10);
  uVar73 = *(ulong *)(prim + uVar67 * 0xb + 6);
  uVar121 = (undefined2)(uVar73 >> 0x30);
  auVar173._8_4_ = 0;
  auVar173._0_8_ = uVar73;
  auVar173._12_2_ = uVar121;
  auVar173._14_2_ = uVar121;
  uVar121 = (undefined2)(uVar73 >> 0x20);
  auVar172._12_4_ = auVar173._12_4_;
  auVar172._8_2_ = 0;
  auVar172._0_8_ = uVar73;
  auVar172._10_2_ = uVar121;
  auVar171._10_6_ = auVar172._10_6_;
  auVar171._8_2_ = uVar121;
  auVar171._0_8_ = uVar73;
  uVar121 = (undefined2)(uVar73 >> 0x10);
  auVar54._4_8_ = auVar171._8_8_;
  auVar54._2_2_ = uVar121;
  auVar54._0_2_ = uVar121;
  uVar10 = *(ulong *)(prim + uVar67 * 9 + 6);
  uVar121 = (undefined2)(uVar10 >> 0x30);
  auVar89._8_4_ = 0;
  auVar89._0_8_ = uVar10;
  auVar89._12_2_ = uVar121;
  auVar89._14_2_ = uVar121;
  uVar121 = (undefined2)(uVar10 >> 0x20);
  auVar88._12_4_ = auVar89._12_4_;
  auVar88._8_2_ = 0;
  auVar88._0_8_ = uVar10;
  auVar88._10_2_ = uVar121;
  auVar87._10_6_ = auVar88._10_6_;
  auVar87._8_2_ = uVar121;
  auVar87._0_8_ = uVar10;
  uVar121 = (undefined2)(uVar10 >> 0x10);
  auVar55._4_8_ = auVar87._8_8_;
  auVar55._2_2_ = uVar121;
  auVar55._0_2_ = uVar121;
  fVar153 = (float)(auVar55._0_4_ >> 0x10);
  fVar230 = (float)(auVar87._8_4_ >> 0x10);
  uVar11 = *(ulong *)(prim + uVar67 * 0xd + 6);
  uVar121 = (undefined2)(uVar11 >> 0x30);
  auVar246._8_4_ = 0;
  auVar246._0_8_ = uVar11;
  auVar246._12_2_ = uVar121;
  auVar246._14_2_ = uVar121;
  uVar121 = (undefined2)(uVar11 >> 0x20);
  auVar245._12_4_ = auVar246._12_4_;
  auVar245._8_2_ = 0;
  auVar245._0_8_ = uVar11;
  auVar245._10_2_ = uVar121;
  auVar244._10_6_ = auVar245._10_6_;
  auVar244._8_2_ = uVar121;
  auVar244._0_8_ = uVar11;
  uVar121 = (undefined2)(uVar11 >> 0x10);
  auVar56._4_8_ = auVar244._8_8_;
  auVar56._2_2_ = uVar121;
  auVar56._0_2_ = uVar121;
  uVar12 = *(ulong *)(prim + uVar67 * 0x12 + 6);
  uVar121 = (undefined2)(uVar12 >> 0x30);
  auVar92._8_4_ = 0;
  auVar92._0_8_ = uVar12;
  auVar92._12_2_ = uVar121;
  auVar92._14_2_ = uVar121;
  uVar121 = (undefined2)(uVar12 >> 0x20);
  auVar91._12_4_ = auVar92._12_4_;
  auVar91._8_2_ = 0;
  auVar91._0_8_ = uVar12;
  auVar91._10_2_ = uVar121;
  auVar90._10_6_ = auVar91._10_6_;
  auVar90._8_2_ = uVar121;
  auVar90._0_8_ = uVar12;
  uVar121 = (undefined2)(uVar12 >> 0x10);
  auVar57._4_8_ = auVar90._8_8_;
  auVar57._2_2_ = uVar121;
  auVar57._0_2_ = uVar121;
  fVar167 = (float)(auVar57._0_4_ >> 0x10);
  fVar231 = (float)(auVar90._8_4_ >> 0x10);
  uVar75 = (ulong)(uint)((int)(uVar67 * 5) << 2);
  uVar13 = *(ulong *)(prim + uVar67 * 2 + uVar75 + 6);
  uVar121 = (undefined2)(uVar13 >> 0x30);
  auVar264._8_4_ = 0;
  auVar264._0_8_ = uVar13;
  auVar264._12_2_ = uVar121;
  auVar264._14_2_ = uVar121;
  uVar121 = (undefined2)(uVar13 >> 0x20);
  auVar263._12_4_ = auVar264._12_4_;
  auVar263._8_2_ = 0;
  auVar263._0_8_ = uVar13;
  auVar263._10_2_ = uVar121;
  auVar262._10_6_ = auVar263._10_6_;
  auVar262._8_2_ = uVar121;
  auVar262._0_8_ = uVar13;
  uVar121 = (undefined2)(uVar13 >> 0x10);
  auVar58._4_8_ = auVar262._8_8_;
  auVar58._2_2_ = uVar121;
  auVar58._0_2_ = uVar121;
  uVar75 = *(ulong *)(prim + uVar75 + 6);
  uVar121 = (undefined2)(uVar75 >> 0x30);
  auVar95._8_4_ = 0;
  auVar95._0_8_ = uVar75;
  auVar95._12_2_ = uVar121;
  auVar95._14_2_ = uVar121;
  uVar121 = (undefined2)(uVar75 >> 0x20);
  auVar94._12_4_ = auVar95._12_4_;
  auVar94._8_2_ = 0;
  auVar94._0_8_ = uVar75;
  auVar94._10_2_ = uVar121;
  auVar93._10_6_ = auVar94._10_6_;
  auVar93._8_2_ = uVar121;
  auVar93._0_8_ = uVar75;
  uVar121 = (undefined2)(uVar75 >> 0x10);
  auVar59._4_8_ = auVar93._8_8_;
  auVar59._2_2_ = uVar121;
  auVar59._0_2_ = uVar121;
  fVar169 = (float)(auVar59._0_4_ >> 0x10);
  fVar232 = (float)(auVar93._8_4_ >> 0x10);
  uVar14 = *(ulong *)(prim + uVar67 * 0x18 + 6);
  uVar121 = (undefined2)(uVar14 >> 0x30);
  auVar276._8_4_ = 0;
  auVar276._0_8_ = uVar14;
  auVar276._12_2_ = uVar121;
  auVar276._14_2_ = uVar121;
  uVar121 = (undefined2)(uVar14 >> 0x20);
  auVar275._12_4_ = auVar276._12_4_;
  auVar275._8_2_ = 0;
  auVar275._0_8_ = uVar14;
  auVar275._10_2_ = uVar121;
  auVar274._10_6_ = auVar275._10_6_;
  auVar274._8_2_ = uVar121;
  auVar274._0_8_ = uVar14;
  uVar121 = (undefined2)(uVar14 >> 0x10);
  auVar60._4_8_ = auVar274._8_8_;
  auVar60._2_2_ = uVar121;
  auVar60._0_2_ = uVar121;
  uVar15 = *(ulong *)(prim + uVar67 * 0x1d + 6);
  uVar121 = (undefined2)(uVar15 >> 0x30);
  auVar98._8_4_ = 0;
  auVar98._0_8_ = uVar15;
  auVar98._12_2_ = uVar121;
  auVar98._14_2_ = uVar121;
  uVar121 = (undefined2)(uVar15 >> 0x20);
  auVar97._12_4_ = auVar98._12_4_;
  auVar97._8_2_ = 0;
  auVar97._0_8_ = uVar15;
  auVar97._10_2_ = uVar121;
  auVar96._10_6_ = auVar97._10_6_;
  auVar96._8_2_ = uVar121;
  auVar96._0_8_ = uVar15;
  uVar121 = (undefined2)(uVar15 >> 0x10);
  auVar61._4_8_ = auVar96._8_8_;
  auVar61._2_2_ = uVar121;
  auVar61._0_2_ = uVar121;
  fVar187 = (float)(auVar61._0_4_ >> 0x10);
  fVar238 = (float)(auVar96._8_4_ >> 0x10);
  uVar16 = *(ulong *)(prim + uVar67 + (ulong)(byte)PVar18 * 0x20 + 6);
  uVar121 = (undefined2)(uVar16 >> 0x30);
  auVar286._8_4_ = 0;
  auVar286._0_8_ = uVar16;
  auVar286._12_2_ = uVar121;
  auVar286._14_2_ = uVar121;
  uVar121 = (undefined2)(uVar16 >> 0x20);
  auVar285._12_4_ = auVar286._12_4_;
  auVar285._8_2_ = 0;
  auVar285._0_8_ = uVar16;
  auVar285._10_2_ = uVar121;
  auVar284._10_6_ = auVar285._10_6_;
  auVar284._8_2_ = uVar121;
  auVar284._0_8_ = uVar16;
  uVar121 = (undefined2)(uVar16 >> 0x10);
  auVar62._4_8_ = auVar284._8_8_;
  auVar62._2_2_ = uVar121;
  auVar62._0_2_ = uVar121;
  uVar17 = *(ulong *)(prim + ((ulong)(byte)PVar18 * 0x20 - uVar67) + 6);
  uVar121 = (undefined2)(uVar17 >> 0x30);
  auVar101._8_4_ = 0;
  auVar101._0_8_ = uVar17;
  auVar101._12_2_ = uVar121;
  auVar101._14_2_ = uVar121;
  uVar121 = (undefined2)(uVar17 >> 0x20);
  auVar100._12_4_ = auVar101._12_4_;
  auVar100._8_2_ = 0;
  auVar100._0_8_ = uVar17;
  auVar100._10_2_ = uVar121;
  auVar99._10_6_ = auVar100._10_6_;
  auVar99._8_2_ = uVar121;
  auVar99._0_8_ = uVar17;
  uVar121 = (undefined2)(uVar17 >> 0x10);
  auVar63._4_8_ = auVar99._8_8_;
  auVar63._2_2_ = uVar121;
  auVar63._0_2_ = uVar121;
  fVar188 = (float)(auVar63._0_4_ >> 0x10);
  fVar239 = (float)(auVar99._8_4_ >> 0x10);
  uVar67 = *(ulong *)(prim + uVar67 * 0x23 + 6);
  uVar121 = (undefined2)(uVar67 >> 0x30);
  auVar296._8_4_ = 0;
  auVar296._0_8_ = uVar67;
  auVar296._12_2_ = uVar121;
  auVar296._14_2_ = uVar121;
  uVar121 = (undefined2)(uVar67 >> 0x20);
  auVar295._12_4_ = auVar296._12_4_;
  auVar295._8_2_ = 0;
  auVar295._0_8_ = uVar67;
  auVar295._10_2_ = uVar121;
  auVar294._10_6_ = auVar295._10_6_;
  auVar294._8_2_ = uVar121;
  auVar294._0_8_ = uVar67;
  uVar121 = (undefined2)(uVar67 >> 0x10);
  auVar64._4_8_ = auVar294._8_8_;
  auVar64._2_2_ = uVar121;
  auVar64._0_2_ = uVar121;
  auVar174._0_8_ =
       CONCAT44(((((float)(auVar54._0_4_ >> 0x10) - fVar152) * fVar280 + fVar152) - fVar310) *
                fVar124,((((float)(int)(short)uVar73 - (float)(int)(short)uVar68) * fVar280 +
                         (float)(int)(short)uVar68) - fVar303) * fVar168);
  auVar174._8_4_ =
       ((((float)(auVar171._8_4_ >> 0x10) - fVar208) * fVar280 + fVar208) - fVar311) * fVar189;
  auVar174._12_4_ =
       ((((float)(auVar172._12_4_ >> 0x10) - (float)(auVar249._12_4_ >> 0x10)) * fVar280 +
        (float)(auVar249._12_4_ >> 0x10)) - fVar312) * fVar242;
  auVar247._0_4_ =
       ((((float)(int)(short)uVar11 - (float)(int)(short)uVar10) * fVar280 +
        (float)(int)(short)uVar10) - fVar303) * fVar168;
  auVar247._4_4_ =
       ((((float)(auVar56._0_4_ >> 0x10) - fVar153) * fVar280 + fVar153) - fVar310) * fVar124;
  auVar247._8_4_ =
       ((((float)(auVar244._8_4_ >> 0x10) - fVar230) * fVar280 + fVar230) - fVar311) * fVar189;
  auVar247._12_4_ =
       ((((float)(auVar245._12_4_ >> 0x10) - (float)(auVar88._12_4_ >> 0x10)) * fVar280 +
        (float)(auVar88._12_4_ >> 0x10)) - fVar312) * fVar242;
  auVar265._0_8_ =
       CONCAT44(((((float)(auVar58._0_4_ >> 0x10) - fVar167) * fVar280 + fVar167) - fVar271) *
                fVar127,((((float)(int)(short)uVar13 - (float)(int)(short)uVar12) * fVar280 +
                         (float)(int)(short)uVar12) - fVar261) * fVar84);
  auVar265._8_4_ =
       ((((float)(auVar262._8_4_ >> 0x10) - fVar231) * fVar280 + fVar231) - fVar272) * fVar206;
  auVar265._12_4_ =
       ((((float)(auVar263._12_4_ >> 0x10) - (float)(auVar91._12_4_ >> 0x10)) * fVar280 +
        (float)(auVar91._12_4_ >> 0x10)) - fVar302) * fVar252;
  auVar277._0_4_ =
       ((((float)(int)(short)uVar14 - (float)(int)(short)uVar75) * fVar280 +
        (float)(int)(short)uVar75) - fVar261) * fVar84;
  auVar277._4_4_ =
       ((((float)(auVar60._0_4_ >> 0x10) - fVar169) * fVar280 + fVar169) - fVar271) * fVar127;
  auVar277._8_4_ =
       ((((float)(auVar274._8_4_ >> 0x10) - fVar232) * fVar280 + fVar232) - fVar272) * fVar206;
  auVar277._12_4_ =
       ((((float)(auVar275._12_4_ >> 0x10) - (float)(auVar94._12_4_ >> 0x10)) * fVar280 +
        (float)(auVar94._12_4_ >> 0x10)) - fVar302) * fVar252;
  auVar287._0_8_ =
       CONCAT44(((((float)(auVar62._0_4_ >> 0x10) - fVar187) * fVar280 + fVar187) - fVar259) *
                fVar151,((((float)(int)(short)uVar16 - (float)(int)(short)uVar15) * fVar280 +
                         (float)(int)(short)uVar15) - fVar254) * fVar122);
  auVar287._8_4_ =
       ((((float)(auVar284._8_4_ >> 0x10) - fVar238) * fVar280 + fVar238) - fVar260) * fVar207;
  auVar287._12_4_ =
       ((((float)(auVar285._12_4_ >> 0x10) - (float)(auVar97._12_4_ >> 0x10)) * fVar280 +
        (float)(auVar97._12_4_ >> 0x10)) - fVar273) * fVar253;
  auVar297._0_4_ =
       ((((float)(int)(short)uVar67 - (float)(int)(short)uVar17) * fVar280 +
        (float)(int)(short)uVar17) - fVar254) * fVar122;
  auVar297._4_4_ =
       ((((float)(auVar64._0_4_ >> 0x10) - fVar188) * fVar280 + fVar188) - fVar259) * fVar151;
  auVar297._8_4_ =
       ((((float)(auVar294._8_4_ >> 0x10) - fVar239) * fVar280 + fVar239) - fVar260) * fVar207;
  auVar297._12_4_ =
       ((((float)(auVar295._12_4_ >> 0x10) - (float)(auVar100._12_4_ >> 0x10)) * fVar280 +
        (float)(auVar100._12_4_ >> 0x10)) - fVar273) * fVar253;
  auVar154._8_4_ = auVar174._8_4_;
  auVar154._0_8_ = auVar174._0_8_;
  auVar154._12_4_ = auVar174._12_4_;
  auVar155 = minps(auVar154,auVar247);
  auVar102._8_4_ = auVar265._8_4_;
  auVar102._0_8_ = auVar265._0_8_;
  auVar102._12_4_ = auVar265._12_4_;
  auVar86 = minps(auVar102,auVar277);
  auVar155 = maxps(auVar155,auVar86);
  auVar103._8_4_ = auVar287._8_4_;
  auVar103._0_8_ = auVar287._0_8_;
  auVar103._12_4_ = auVar287._12_4_;
  auVar86 = minps(auVar103,auVar297);
  uVar71 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar137._4_4_ = uVar71;
  auVar137._0_4_ = uVar71;
  auVar137._8_4_ = uVar71;
  auVar137._12_4_ = uVar71;
  auVar86 = maxps(auVar86,auVar137);
  auVar86 = maxps(auVar155,auVar86);
  auVar155 = maxps(auVar174,auVar247);
  auVar266 = maxps(auVar265,auVar277);
  auVar155 = minps(auVar155,auVar266);
  local_1b8 = auVar86._0_4_ * 0.99999964;
  fStack_1b4 = auVar86._4_4_ * 0.99999964;
  fStack_1b0 = auVar86._8_4_ * 0.99999964;
  fStack_1ac = auVar86._12_4_ * 0.99999964;
  auVar86 = maxps(auVar287,auVar297);
  fVar168 = (ray->super_RayK<1>).tfar;
  auVar104._4_4_ = fVar168;
  auVar104._0_4_ = fVar168;
  auVar104._8_4_ = fVar168;
  auVar104._12_4_ = fVar168;
  auVar86 = minps(auVar86,auVar104);
  auVar86 = minps(auVar155,auVar86);
  uVar79 = (uint)(byte)PVar18;
  auVar138._0_4_ = -(uint)(uVar79 != 0 && local_1b8 <= auVar86._0_4_ * 1.0000004);
  auVar138._4_4_ = -(uint)(1 < uVar79 && fStack_1b4 <= auVar86._4_4_ * 1.0000004);
  auVar138._8_4_ = -(uint)(2 < uVar79 && fStack_1b0 <= auVar86._8_4_ * 1.0000004);
  auVar138._12_4_ = -(uint)(3 < uVar79 && fStack_1ac <= auVar86._12_4_ * 1.0000004);
  uVar79 = movmskps(uVar79,auVar138);
  if (uVar79 == 0) {
    return;
  }
  uVar79 = uVar79 & 0xff;
  local_178._0_12_ = mm_lookupmask_ps._240_12_;
  local_178._12_4_ = 0;
  local_2b8 = prim;
LAB_00bd8559:
  local_2b0 = (ulong)uVar79;
  lVar77 = 0;
  if (local_2b0 != 0) {
    for (; (uVar79 >> lVar77 & 1) == 0; lVar77 = lVar77 + 1) {
    }
  }
  local_570 = (RTCIntersectArguments *)(ulong)*(uint *)(local_2b8 + 2);
  local_520 = (ulong)*(uint *)(local_2b8 + lVar77 * 4 + 6);
  pGVar19 = (context->scene->geometries).items[(long)local_570].ptr;
  uVar68 = (ulong)*(uint *)(*(long *)&pGVar19->field_0x58 +
                           local_520 *
                           pGVar19[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  local_4d8 = pGVar19->fnumTimeSegments;
  fVar168 = (pGVar19->time_range).lower;
  fVar168 = (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar168) /
            ((pGVar19->time_range).upper - fVar168)) * local_4d8;
  _local_548 = ZEXT416((uint)fVar168);
  fVar168 = floorf(fVar168);
  if (local_4d8 + -1.0 <= fVar168) {
    fVar168 = local_4d8 + -1.0;
  }
  fVar84 = 0.0;
  if (0.0 <= fVar168) {
    fVar84 = fVar168;
  }
  fVar127 = (float)local_548._0_4_ - fVar84;
  fVar152 = 1.0 - fVar127;
  _Var20 = pGVar19[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar76 = (long)(int)fVar84 * 0x38;
  lVar77 = *(long *)(_Var20 + lVar76);
  lVar21 = *(long *)(_Var20 + 0x10 + lVar76);
  lVar74 = lVar21 * (uVar68 + 2);
  pRVar72 = (RTCIntersectArguments *)(lVar21 * (uVar68 + 3));
  lVar22 = *(long *)(_Var20 + 0x38 + lVar76);
  lVar76 = *(long *)(_Var20 + 0x48 + lVar76);
  pfVar1 = (float *)(lVar22 + uVar68 * lVar76);
  pfVar2 = (float *)(lVar77 + lVar21 * uVar68);
  local_4d8 = *pfVar2 * fVar152 + *pfVar1 * fVar127;
  fStack_4d4 = pfVar2[1] * fVar152 + pfVar1[1] * fVar127;
  fStack_4d0 = pfVar2[2] * fVar152 + pfVar1[2] * fVar127;
  pfVar3 = (float *)(lVar22 + (uVar68 + 1) * lVar76);
  pfVar4 = (float *)(lVar77 + lVar21 * (uVar68 + 1));
  local_468 = *pfVar4 * fVar152 + *pfVar3 * fVar127;
  fStack_464 = pfVar4[1] * fVar152 + pfVar3[1] * fVar127;
  fStack_460 = pfVar4[2] * fVar152 + pfVar3[2] * fVar127;
  pfVar5 = (float *)(lVar22 + (uVar68 + 2) * lVar76);
  pfVar6 = (float *)(lVar77 + lVar74);
  local_478 = *pfVar6 * fVar152 + *pfVar5 * fVar127;
  fStack_474 = pfVar6[1] * fVar152 + pfVar5[1] * fVar127;
  fStack_470 = pfVar6[2] * fVar152 + pfVar5[2] * fVar127;
  pfVar7 = (float *)(lVar22 + lVar76 * (uVar68 + 3));
  pfVar8 = (float *)((long)&pRVar72->flags + lVar77);
  local_268 = fVar152 * *pfVar8 + fVar127 * *pfVar7;
  local_278 = fVar152 * pfVar8[1] + fVar127 * pfVar7[1];
  local_288 = fVar152 * pfVar8[2] + fVar127 * pfVar7[2];
  fVar168 = (ray->super_RayK<1>).org.field_0.m128[0];
  fVar84 = (ray->super_RayK<1>).org.field_0.m128[1];
  fVar122 = (ray->super_RayK<1>).org.field_0.m128[2];
  local_358 = (ray->super_RayK<1>).dir.field_0.m128[0];
  local_3f8 = (ray->super_RayK<1>).dir.field_0.m128[1];
  local_348 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fVar124 = (ray->super_RayK<1>).dir.field_0.m128[3];
  fStack_11c = local_358 * local_358;
  fVar153 = local_3f8 * local_3f8;
  fVar167 = local_348 * local_348;
  fVar124 = fVar124 * fVar124;
  fVar151 = fStack_11c + fVar153 + fVar167;
  auVar190._0_8_ = CONCAT44(fVar153 + fVar153 + fVar124,fVar151);
  auVar190._8_4_ = fVar167 + fVar153 + fVar167;
  auVar190._12_4_ = fVar124 + fVar153 + fVar124;
  auVar175._8_4_ = auVar190._8_4_;
  auVar175._0_8_ = auVar190._0_8_;
  auVar175._12_4_ = auVar190._12_4_;
  auVar86 = rcpss(auVar175,auVar190);
  local_3c8 = (2.0 - fVar151 * auVar86._0_4_) * auVar86._0_4_ *
              (((fStack_4d0 + fStack_460 + fStack_470 + local_288) * 0.25 - fVar122) * local_348 +
              ((fStack_4d4 + fStack_464 + fStack_474 + local_278) * 0.25 - fVar84) * local_3f8 +
              ((local_4d8 + local_468 + local_478 + local_268) * 0.25 - fVar168) * local_358);
  local_2e8 = ZEXT416((uint)local_3c8);
  fStack_3c4 = local_3c8;
  fStack_3c0 = local_3c8;
  fStack_3bc = local_3c8;
  fVar168 = local_358 * local_3c8 + fVar168;
  fVar84 = local_3f8 * local_3c8 + fVar84;
  fVar122 = local_348 * local_3c8 + fVar122;
  local_4d8 = local_4d8 - fVar168;
  fStack_4d4 = fStack_4d4 - fVar84;
  fStack_4d0 = fStack_4d0 - fVar122;
  fStack_4cc = (pfVar2[3] * fVar152 + pfVar1[3] * fVar127) - 0.0;
  local_478 = local_478 - fVar168;
  fStack_474 = fStack_474 - fVar84;
  fStack_470 = fStack_470 - fVar122;
  fStack_46c = (pfVar6[3] * fVar152 + pfVar5[3] * fVar127) - 0.0;
  local_468 = local_468 - fVar168;
  fStack_464 = fStack_464 - fVar84;
  fStack_460 = fStack_460 - fVar122;
  fStack_45c = (pfVar4[3] * fVar152 + pfVar3[3] * fVar127) - 0.0;
  local_268 = local_268 - fVar168;
  local_278 = local_278 - fVar84;
  local_288 = local_288 - fVar122;
  fStack_53c = (fVar152 * pfVar8[3] + fVar127 * pfVar7[3]) - 0.0;
  local_1e8 = local_4d8;
  fStack_1e4 = local_4d8;
  fStack_1e0 = local_4d8;
  fStack_1dc = local_4d8;
  local_1f8 = fStack_4d4;
  fStack_1f4 = fStack_4d4;
  fStack_1f0 = fStack_4d4;
  fStack_1ec = fStack_4d4;
  local_138 = fStack_4d0;
  fStack_134 = fStack_4d0;
  fStack_130 = fStack_4d0;
  fStack_12c = fStack_4d0;
  local_148 = fStack_4cc;
  fStack_144 = fStack_4cc;
  fStack_140 = fStack_4cc;
  fStack_13c = fStack_4cc;
  local_208 = local_468;
  fStack_204 = local_468;
  fStack_200 = local_468;
  fStack_1fc = local_468;
  local_158 = fStack_464;
  fStack_154 = fStack_464;
  fStack_150 = fStack_464;
  fStack_14c = fStack_464;
  local_218 = fStack_460;
  fStack_214 = fStack_460;
  fStack_210 = fStack_460;
  fStack_20c = fStack_460;
  local_128 = fStack_11c + fVar167 + fVar153;
  fStack_124 = fStack_11c + fVar167 + fVar153;
  fStack_120 = fStack_11c + fVar167 + fVar153;
  fStack_11c = fStack_11c + fVar167 + fVar153;
  local_168 = fStack_45c;
  fStack_164 = fStack_45c;
  fStack_160 = fStack_45c;
  fStack_15c = fStack_45c;
  local_228 = local_478;
  fStack_224 = local_478;
  fStack_220 = local_478;
  fStack_21c = local_478;
  local_238 = fStack_474;
  fStack_234 = fStack_474;
  fStack_230 = fStack_474;
  fStack_22c = fStack_474;
  local_248 = fStack_470;
  fStack_244 = fStack_470;
  fStack_240 = fStack_470;
  fStack_23c = fStack_470;
  local_258 = fStack_46c;
  fStack_254 = fStack_46c;
  fStack_250 = fStack_46c;
  fStack_24c = fStack_46c;
  fStack_264 = local_268;
  fStack_260 = local_268;
  fStack_25c = local_268;
  fStack_274 = local_278;
  fStack_270 = local_278;
  fStack_26c = local_278;
  fStack_284 = local_288;
  fStack_280 = local_288;
  fStack_27c = local_288;
  local_548._4_4_ = local_278;
  local_548._0_4_ = local_268;
  fStack_540 = local_288;
  local_298 = fStack_53c;
  fStack_294 = fStack_53c;
  fStack_290 = fStack_53c;
  fStack_28c = fStack_53c;
  fStack_354 = local_358;
  fStack_350 = local_358;
  fStack_34c = local_358;
  fStack_3f4 = local_3f8;
  fStack_3f0 = local_3f8;
  fStack_3ec = local_3f8;
  fStack_344 = local_348;
  fStack_340 = local_348;
  fStack_33c = local_348;
  local_2a8 = (uint)local_128 & (uint)DAT_01fec6c0;
  uStack_2a4 = (uint)fStack_124 & DAT_01fec6c0._4_4_;
  uStack_2a0 = (uint)fStack_120 & DAT_01fec6c0._8_4_;
  uStack_29c = (uint)fStack_11c & DAT_01fec6c0._12_4_;
  uVar68 = 1;
  local_490 = 1;
  fVar168 = 0.0;
  fVar84 = 1.0;
  uVar71 = 0;
  uVar66 = 0;
  uVar73 = 0;
  auVar86 = _DAT_01fec6c0;
  do {
    local_3b8 = fVar84 - fVar168;
    fVar122 = local_3b8 * 0.11111111;
    local_408 = fVar168;
    fStack_404 = fVar84;
    uStack_400 = uVar71;
    uStack_3fc = uVar66;
    fStack_3b4 = local_3b8;
    fStack_3b0 = local_3b8;
    fStack_3ac = local_3b8;
    local_3e8 = fVar168;
    fStack_3e4 = fVar168;
    fStack_3e0 = fVar168;
    fStack_3dc = fVar168;
    fVar252 = local_3b8 * 0.0 + fVar168;
    fVar253 = local_3b8 * 0.33333334 + fVar168;
    fVar261 = local_3b8 * 0.6666667 + fVar168;
    fVar271 = local_3b8 * 1.0 + fVar168;
    fVar207 = 1.0 - fVar252;
    fVar208 = 1.0 - fVar253;
    fVar230 = 1.0 - fVar261;
    fVar242 = 1.0 - fVar271;
    fVar84 = fVar252 * fVar207;
    fVar124 = fVar253 * fVar208;
    fVar127 = fVar261 * fVar230;
    fVar151 = fVar271 * fVar242;
    fVar152 = fVar207 * fVar207 * fVar207;
    fVar153 = fVar208 * fVar208 * fVar208;
    fVar167 = fVar230 * fVar230 * fVar230;
    fVar169 = fVar242 * fVar242 * fVar242;
    fVar260 = fVar252 * fVar252 * fVar252;
    fVar273 = fVar253 * fVar253 * fVar253;
    fVar280 = fVar261 * fVar261 * fVar261;
    fVar281 = fVar271 * fVar271 * fVar271;
    fVar187 = fVar152 * 0.16666667;
    fVar188 = fVar153 * 0.16666667;
    fVar189 = fVar167 * 0.16666667;
    fVar206 = fVar169 * 0.16666667;
    fVar272 = (fVar252 * fVar84 * 6.0 + fVar207 * fVar84 * 12.0 + fVar152 * 4.0 + fVar260) *
              0.16666667;
    fVar302 = (fVar253 * fVar124 * 6.0 + fVar208 * fVar124 * 12.0 + fVar153 * 4.0 + fVar273) *
              0.16666667;
    fVar254 = (fVar261 * fVar127 * 6.0 + fVar230 * fVar127 * 12.0 + fVar167 * 4.0 + fVar280) *
              0.16666667;
    fVar259 = (fVar271 * fVar151 * 6.0 + fVar242 * fVar151 * 12.0 + fVar169 * 4.0 + fVar281) *
              0.16666667;
    fVar152 = (fVar207 * fVar84 * 6.0 + fVar252 * fVar84 * 12.0 + fVar260 * 4.0 + fVar152) *
              0.16666667;
    fVar153 = (fVar208 * fVar124 * 6.0 + fVar253 * fVar124 * 12.0 + fVar273 * 4.0 + fVar153) *
              0.16666667;
    fVar167 = (fVar230 * fVar127 * 6.0 + fVar261 * fVar127 * 12.0 + fVar280 * 4.0 + fVar167) *
              0.16666667;
    fVar169 = (fVar242 * fVar151 * 6.0 + fVar271 * fVar151 * 12.0 + fVar281 * 4.0 + fVar169) *
              0.16666667;
    fVar260 = fVar260 * 0.16666667;
    fVar273 = fVar273 * 0.16666667;
    fVar280 = fVar280 * 0.16666667;
    fVar281 = fVar281 * 0.16666667;
    local_4f8 = local_1e8 * fVar187 +
                local_208 * fVar272 + local_228 * fVar152 + local_268 * fVar260;
    fStack_4f4 = fStack_1e4 * fVar188 +
                 fStack_204 * fVar302 + fStack_224 * fVar153 + fStack_264 * fVar273;
    fStack_4f0 = fStack_1e0 * fVar189 +
                 fStack_200 * fVar254 + fStack_220 * fVar167 + fStack_260 * fVar280;
    fStack_4ec = fStack_1dc * fVar206 +
                 fStack_1fc * fVar259 + fStack_21c * fVar169 + fStack_25c * fVar281;
    local_4e8 = local_1f8 * fVar187 +
                local_158 * fVar272 + local_238 * fVar152 + local_278 * fVar260;
    fStack_4e4 = fStack_1f4 * fVar188 +
                 fStack_154 * fVar302 + fStack_234 * fVar153 + fStack_274 * fVar273;
    fStack_4e0 = fStack_1f0 * fVar189 +
                 fStack_150 * fVar254 + fStack_230 * fVar167 + fStack_270 * fVar280;
    fStack_4dc = fStack_1ec * fVar206 +
                 fStack_14c * fVar259 + fStack_22c * fVar169 + fStack_26c * fVar281;
    fVar231 = local_138 * fVar187 + local_218 * fVar272 + local_248 * fVar152 + local_288 * fVar260;
    fVar232 = fStack_134 * fVar188 +
              fStack_214 * fVar302 + fStack_244 * fVar153 + fStack_284 * fVar273;
    fVar238 = fStack_130 * fVar189 +
              fStack_210 * fVar254 + fStack_240 * fVar167 + fStack_280 * fVar280;
    fVar239 = fStack_12c * fVar206 +
              fStack_20c * fVar259 + fStack_23c * fVar169 + fStack_27c * fVar281;
    local_5e8._0_4_ =
         fVar187 * local_148 + fVar272 * local_168 + fVar152 * local_258 + fVar260 * local_298;
    local_5e8._4_4_ =
         fVar188 * fStack_144 + fVar302 * fStack_164 + fVar153 * fStack_254 + fVar273 * fStack_294;
    fStack_5e0 = fVar189 * fStack_140 +
                 fVar254 * fStack_160 + fVar167 * fStack_250 + fVar280 * fStack_290;
    fStack_5dc = fVar206 * fStack_13c +
                 fVar259 * fStack_15c + fVar169 * fStack_24c + fVar281 * fStack_28c;
    fVar152 = -fVar207 * fVar207 * 0.5;
    fVar153 = -fVar208 * fVar208 * 0.5;
    fVar167 = -fVar230 * fVar230 * 0.5;
    fVar169 = -fVar242 * fVar242 * 0.5;
    fVar188 = (-fVar252 * fVar252 - fVar84 * 4.0) * 0.5;
    fVar187 = (-fVar253 * fVar253 - fVar124 * 4.0) * 0.5;
    fVar189 = (-fVar261 * fVar261 - fVar127 * 4.0) * 0.5;
    fVar206 = (-fVar271 * fVar271 - fVar151 * 4.0) * 0.5;
    fVar84 = (fVar84 * 4.0 + fVar207 * fVar207) * 0.5;
    fVar124 = (fVar124 * 4.0 + fVar208 * fVar208) * 0.5;
    fVar127 = (fVar127 * 4.0 + fVar230 * fVar230) * 0.5;
    fVar151 = (fVar151 * 4.0 + fVar242 * fVar242) * 0.5;
    fVar230 = fVar252 * fVar252 * 0.5;
    fVar207 = fVar253 * fVar253 * 0.5;
    fVar208 = fVar261 * fVar261 * 0.5;
    fVar242 = fVar271 * fVar271 * 0.5;
    local_588._0_4_ =
         (local_1e8 * fVar152 + local_208 * fVar188 + local_228 * fVar84 + local_268 * fVar230) *
         fVar122;
    local_598 = (fStack_1e4 * fVar153 +
                fStack_204 * fVar187 + fStack_224 * fVar124 + fStack_264 * fVar207) * fVar122;
    fStack_594 = (fStack_1e0 * fVar167 +
                 fStack_200 * fVar189 + fStack_220 * fVar127 + fStack_260 * fVar208) * fVar122;
    fStack_590 = (fStack_1dc * fVar169 +
                 fStack_1fc * fVar206 + fStack_21c * fVar151 + fStack_25c * fVar242) * fVar122;
    local_5a8 = (local_1f8 * fVar152 +
                local_158 * fVar188 + local_238 * fVar84 + local_278 * fVar230) * fVar122;
    fStack_5a4 = (fStack_1f4 * fVar153 +
                 fStack_154 * fVar187 + fStack_234 * fVar124 + fStack_274 * fVar207) * fVar122;
    fStack_5a0 = (fStack_1f0 * fVar167 +
                 fStack_150 * fVar189 + fStack_230 * fVar127 + fStack_270 * fVar208) * fVar122;
    fStack_59c = (fStack_1ec * fVar169 +
                 fStack_14c * fVar206 + fStack_22c * fVar151 + fStack_26c * fVar242) * fVar122;
    local_538 = (local_138 * fVar152 +
                local_218 * fVar188 + local_248 * fVar84 + local_288 * fVar230) * fVar122;
    fStack_534 = (fStack_134 * fVar153 +
                 fStack_214 * fVar187 + fStack_244 * fVar124 + fStack_284 * fVar207) * fVar122;
    fStack_530 = (fStack_130 * fVar167 +
                 fStack_210 * fVar189 + fStack_240 * fVar127 + fStack_280 * fVar208) * fVar122;
    fStack_52c = (fStack_12c * fVar169 +
                 fStack_20c * fVar206 + fStack_23c * fVar151 + fStack_27c * fVar242) * fVar122;
    fVar124 = fVar122 * (fVar153 * fStack_144 +
                        fVar187 * fStack_164 + fVar124 * fStack_254 + fVar207 * fStack_294);
    fVar127 = fVar122 * (fVar167 * fStack_140 +
                        fVar189 * fStack_160 + fVar127 * fStack_250 + fVar208 * fStack_290);
    fVar151 = fVar122 * (fVar169 * fStack_13c +
                        fVar206 * fStack_15c + fVar151 * fStack_24c + fVar242 * fStack_28c);
    local_518._4_4_ = fStack_4f0;
    local_518._0_4_ = fStack_4f4;
    fStack_510 = fStack_4ec;
    fStack_50c = 0.0;
    auVar31._4_4_ = fVar232;
    auVar31._0_4_ = fVar231;
    auVar31._8_4_ = fVar238;
    auVar31._12_4_ = fVar239;
    auVar139._0_12_ = local_5e8._4_12_;
    auVar139._12_4_ = 0;
    auVar234._0_8_ = CONCAT44(fStack_5e0 - fVar127,(float)local_5e8._4_4_ - fVar124);
    auVar234._8_4_ = fStack_5dc - fVar151;
    auVar234._12_4_ = 0;
    local_508._0_4_ = fStack_4e4 - local_4e8;
    local_508._4_4_ = fStack_4e0 - fStack_4e4;
    fStack_500 = fStack_4dc - fStack_4e0;
    fStack_4fc = 0.0 - fStack_4dc;
    local_558._12_4_ = 0;
    local_558._0_12_ = auVar31._4_12_;
    local_418._0_4_ = fVar232 - fVar231;
    local_418._4_4_ = fVar238 - fVar232;
    fStack_410 = fVar239 - fVar238;
    fStack_40c = 0.0 - fVar239;
    fVar259 = local_5a8 * (float)local_418._0_4_ - local_538 * (float)local_508._0_4_;
    fVar260 = fStack_5a4 * (float)local_418._4_4_ - fStack_534 * (float)local_508._4_4_;
    fVar273 = fStack_5a0 * fStack_410 - fStack_530 * fStack_500;
    fVar280 = fStack_59c * fStack_40c - fStack_52c * fStack_4fc;
    local_428._0_4_ = fStack_4f4 - local_4f8;
    local_428._4_4_ = fStack_4f0 - fStack_4f4;
    fStack_420 = fStack_4ec - fStack_4f0;
    fStack_41c = 0.0 - fStack_4ec;
    fVar189 = local_538 * (float)local_428._0_4_ - (float)local_588._0_4_ * (float)local_418._0_4_;
    fVar206 = fStack_534 * (float)local_428._4_4_ - local_598 * (float)local_418._4_4_;
    fVar207 = fStack_530 * fStack_420 - fStack_594 * fStack_410;
    fVar208 = fStack_52c * fStack_41c - fStack_590 * fStack_40c;
    fVar242 = (float)local_588._0_4_ * (float)local_508._0_4_ - local_5a8 * (float)local_428._0_4_;
    fVar253 = local_598 * (float)local_508._4_4_ - fStack_5a4 * (float)local_428._4_4_;
    fVar271 = fStack_594 * fStack_500 - fStack_5a0 * fStack_420;
    fVar302 = fStack_590 * fStack_4fc - fStack_59c * fStack_41c;
    auVar225._0_4_ =
         (float)local_508._0_4_ * (float)local_508._0_4_ +
         (float)local_418._0_4_ * (float)local_418._0_4_;
    auVar225._4_4_ =
         (float)local_508._4_4_ * (float)local_508._4_4_ +
         (float)local_418._4_4_ * (float)local_418._4_4_;
    auVar225._8_4_ = fStack_500 * fStack_500 + fStack_410 * fStack_410;
    auVar225._12_4_ = fStack_4fc * fStack_4fc + fStack_40c * fStack_40c;
    auVar267._0_4_ = (float)local_428._0_4_ * (float)local_428._0_4_ + auVar225._0_4_;
    auVar267._4_4_ = (float)local_428._4_4_ * (float)local_428._4_4_ + auVar225._4_4_;
    auVar267._8_4_ = fStack_420 * fStack_420 + auVar225._8_4_;
    auVar267._12_4_ = fStack_41c * fStack_41c + auVar225._12_4_;
    auVar155 = rcpps(auVar225,auVar267);
    fVar153 = auVar155._0_4_;
    fVar167 = auVar155._4_4_;
    fVar169 = auVar155._8_4_;
    fVar187 = auVar155._12_4_;
    fVar153 = (1.0 - fVar153 * auVar267._0_4_) * fVar153 + fVar153;
    fVar167 = (1.0 - fVar167 * auVar267._4_4_) * fVar167 + fVar167;
    fVar169 = (1.0 - fVar169 * auVar267._8_4_) * fVar169 + fVar169;
    fVar187 = (1.0 - fVar187 * auVar267._12_4_) * fVar187 + fVar187;
    fVar252 = (float)local_418._0_4_ * fStack_5a4 - (float)local_508._0_4_ * fStack_534;
    fVar261 = (float)local_418._4_4_ * fStack_5a0 - (float)local_508._4_4_ * fStack_530;
    fVar272 = fStack_410 * fStack_59c - fStack_500 * fStack_52c;
    fVar254 = fStack_40c * 0.0 - fStack_4fc * 0.0;
    local_588._4_4_ = local_598;
    fStack_580 = fStack_594;
    fStack_57c = fStack_590;
    local_388 = fStack_534;
    fStack_384 = fStack_530;
    fStack_380 = fStack_52c;
    uStack_37c = 0;
    fVar281 = (float)local_428._0_4_ * fStack_534 - (float)local_418._0_4_ * local_598;
    fVar282 = (float)local_428._4_4_ * fStack_530 - (float)local_418._4_4_ * fStack_594;
    fVar289 = fStack_420 * fStack_52c - fStack_410 * fStack_590;
    fVar290 = fStack_41c * 0.0 - fStack_40c * 0.0;
    local_378 = fStack_5a4;
    fStack_374 = fStack_5a0;
    fStack_370 = fStack_59c;
    fStack_36c = 0.0;
    fStack_58c = 0.0;
    fVar291 = (float)local_508._0_4_ * local_598 - (float)local_428._0_4_ * fStack_5a4;
    fVar292 = (float)local_508._4_4_ * fStack_594 - (float)local_428._4_4_ * fStack_5a0;
    fVar299 = fStack_500 * fStack_590 - fStack_420 * fStack_59c;
    fVar300 = fStack_4fc * 0.0 - fStack_41c * 0.0;
    auVar255._0_4_ = (fVar259 * fVar259 + fVar189 * fVar189 + fVar242 * fVar242) * fVar153;
    auVar255._4_4_ = (fVar260 * fVar260 + fVar206 * fVar206 + fVar253 * fVar253) * fVar167;
    auVar255._8_4_ = (fVar273 * fVar273 + fVar207 * fVar207 + fVar271 * fVar271) * fVar169;
    auVar255._12_4_ = (fVar280 * fVar280 + fVar208 * fVar208 + fVar302 * fVar302) * fVar187;
    auVar248._0_4_ = (fVar252 * fVar252 + fVar281 * fVar281 + fVar291 * fVar291) * fVar153;
    auVar248._4_4_ = (fVar261 * fVar261 + fVar282 * fVar282 + fVar292 * fVar292) * fVar167;
    auVar248._8_4_ = (fVar272 * fVar272 + fVar289 * fVar289 + fVar299 * fVar299) * fVar169;
    auVar248._12_4_ = (fVar254 * fVar254 + fVar290 * fVar290 + fVar300 * fVar300) * fVar187;
    auVar256 = maxps(auVar255,auVar248);
    auVar105._0_4_ =
         fVar122 * (fVar152 * local_148 +
                   fVar188 * local_168 + fVar84 * local_258 + fVar230 * local_298) +
         (float)local_5e8._0_4_;
    auVar105._4_4_ = fVar124 + (float)local_5e8._4_4_;
    auVar105._8_4_ = fVar127 + fStack_5e0;
    auVar105._12_4_ = fVar151 + fStack_5dc;
    auVar266 = maxps(_local_5e8,auVar105);
    auVar176._8_4_ = auVar234._8_4_;
    auVar176._0_8_ = auVar234._0_8_;
    auVar176._12_4_ = 0;
    auVar155 = maxps(auVar176,auVar139);
    auVar249 = maxps(auVar266,auVar155);
    auVar155 = minps(_local_5e8,auVar105);
    auVar266 = minps(auVar234,auVar139);
    auVar156 = minps(auVar155,auVar266);
    auVar155 = sqrtps(auVar139,auVar256);
    auVar266 = rsqrtps(auVar155,auVar267);
    fVar84 = auVar266._0_4_;
    fVar122 = auVar266._4_4_;
    fVar124 = auVar266._8_4_;
    fVar127 = auVar266._12_4_;
    local_2f8._0_4_ = fVar84 * 1.5 - fVar84 * fVar84 * auVar267._0_4_ * 0.5 * fVar84;
    local_2f8._4_4_ = fVar122 * 1.5 - fVar122 * fVar122 * auVar267._4_4_ * 0.5 * fVar122;
    fStack_2f0 = fVar124 * 1.5 - fVar124 * fVar124 * auVar267._8_4_ * 0.5 * fVar124;
    fStack_2ec = fVar127 * 1.5 - fVar127 * fVar127 * auVar267._12_4_ * 0.5 * fVar127;
    fVar84 = 0.0 - local_4e8;
    fVar127 = 0.0 - fStack_4e4;
    fVar153 = 0.0 - fStack_4e0;
    fVar187 = 0.0 - fStack_4dc;
    local_3a8 = 0.0 - fVar231;
    fStack_3a4 = 0.0 - fVar232;
    fStack_3a0 = 0.0 - fVar238;
    fStack_39c = 0.0 - fVar239;
    local_398 = 0.0 - local_4f8;
    fStack_394 = 0.0 - fStack_4f4;
    fStack_390 = 0.0 - fStack_4f0;
    fStack_38c = 0.0 - fStack_4ec;
    fVar206 = local_358 * (float)local_428._0_4_ * (float)local_2f8._0_4_ +
              local_3f8 * (float)local_508._0_4_ * (float)local_2f8._0_4_ +
              local_348 * (float)local_418._0_4_ * (float)local_2f8._0_4_;
    fVar207 = fStack_354 * (float)local_428._4_4_ * (float)local_2f8._4_4_ +
              fStack_3f4 * (float)local_508._4_4_ * (float)local_2f8._4_4_ +
              fStack_344 * (float)local_418._4_4_ * (float)local_2f8._4_4_;
    fVar208 = fStack_350 * fStack_420 * fStack_2f0 +
              fStack_3f0 * fStack_500 * fStack_2f0 + fStack_340 * fStack_410 * fStack_2f0;
    fVar230 = fStack_34c * fStack_41c * fStack_2ec +
              fStack_3ec * fStack_4fc * fStack_2ec + fStack_33c * fStack_40c * fStack_2ec;
    fVar259 = (float)local_428._0_4_ * (float)local_2f8._0_4_ * local_398 +
              (float)local_508._0_4_ * (float)local_2f8._0_4_ * fVar84 +
              (float)local_418._0_4_ * (float)local_2f8._0_4_ * local_3a8;
    fVar260 = (float)local_428._4_4_ * (float)local_2f8._4_4_ * fStack_394 +
              (float)local_508._4_4_ * (float)local_2f8._4_4_ * fVar127 +
              (float)local_418._4_4_ * (float)local_2f8._4_4_ * fStack_3a4;
    fVar273 = fStack_420 * fStack_2f0 * fStack_390 +
              fStack_500 * fStack_2f0 * fVar153 + fStack_410 * fStack_2f0 * fStack_3a0;
    fVar280 = fStack_41c * fStack_2ec * fStack_38c +
              fStack_4fc * fStack_2ec * fVar187 + fStack_40c * fStack_2ec * fStack_39c;
    fVar242 = (local_358 * local_398 + local_3f8 * fVar84 + local_348 * local_3a8) -
              fVar206 * fVar259;
    fVar252 = (fStack_354 * fStack_394 + fStack_3f4 * fVar127 + fStack_344 * fStack_3a4) -
              fVar207 * fVar260;
    fVar253 = (fStack_350 * fStack_390 + fStack_3f0 * fVar153 + fStack_340 * fStack_3a0) -
              fVar208 * fVar273;
    fVar261 = (fStack_34c * fStack_38c + fStack_3ec * fVar187 + fStack_33c * fStack_39c) -
              fVar230 * fVar280;
    fVar124 = (local_398 * local_398 + fVar84 * fVar84 + local_3a8 * local_3a8) - fVar259 * fVar259;
    fVar152 = (fStack_394 * fStack_394 + fVar127 * fVar127 + fStack_3a4 * fStack_3a4) -
              fVar260 * fVar260;
    fVar169 = (fStack_390 * fStack_390 + fVar153 * fVar153 + fStack_3a0 * fStack_3a0) -
              fVar273 * fVar273;
    fVar189 = (fStack_38c * fStack_38c + fVar187 * fVar187 + fStack_39c * fStack_39c) -
              fVar280 * fVar280;
    fVar122 = (auVar249._0_4_ + auVar155._0_4_) * 1.0000002;
    fVar151 = (auVar249._4_4_ + auVar155._4_4_) * 1.0000002;
    fVar167 = (auVar249._8_4_ + auVar155._8_4_) * 1.0000002;
    fVar188 = (auVar249._12_4_ + auVar155._12_4_) * 1.0000002;
    auVar226._0_4_ = fVar124 - fVar122 * fVar122;
    auVar226._4_4_ = fVar152 - fVar151 * fVar151;
    auVar226._8_4_ = fVar169 - fVar167 * fVar167;
    auVar226._12_4_ = fVar189 - fVar188 * fVar188;
    fVar271 = fVar206 * fVar206;
    fVar272 = fVar207 * fVar207;
    fVar302 = fVar208 * fVar208;
    fVar254 = fVar230 * fVar230;
    fVar281 = local_128 - fVar271;
    fVar282 = fStack_124 - fVar272;
    fVar289 = fStack_120 - fVar302;
    fVar290 = fStack_11c - fVar254;
    fVar242 = fVar242 + fVar242;
    fVar252 = fVar252 + fVar252;
    fVar253 = fVar253 + fVar253;
    fVar261 = fVar261 + fVar261;
    auVar191._0_4_ = fVar242 * fVar242;
    auVar191._4_4_ = fVar252 * fVar252;
    auVar191._8_4_ = fVar253 * fVar253;
    auVar191._12_4_ = fVar261 * fVar261;
    fVar122 = fVar281 * 4.0;
    fVar151 = fVar282 * 4.0;
    fVar167 = fVar289 * 4.0;
    fVar188 = fVar290 * 4.0;
    auVar250._0_4_ = auVar191._0_4_ - fVar122 * auVar226._0_4_;
    auVar250._4_4_ = auVar191._4_4_ - fVar151 * auVar226._4_4_;
    auVar250._8_4_ = auVar191._8_4_ - fVar167 * auVar226._8_4_;
    auVar250._12_4_ = auVar191._12_4_ - fVar188 * auVar226._12_4_;
    local_5e8._4_4_ = (auVar156._4_4_ - auVar155._4_4_) * 0.99999976;
    local_5e8._0_4_ = (auVar156._0_4_ - auVar155._0_4_) * 0.99999976;
    fStack_5e0 = (auVar156._8_4_ - auVar155._8_4_) * 0.99999976;
    fStack_5dc = (auVar156._12_4_ - auVar155._12_4_) * 0.99999976;
    auVar268._4_4_ = -(uint)(0.0 <= auVar250._4_4_);
    auVar268._0_4_ = -(uint)(0.0 <= auVar250._0_4_);
    auVar268._8_4_ = -(uint)(0.0 <= auVar250._8_4_);
    auVar268._12_4_ = -(uint)(0.0 <= auVar250._12_4_);
    uVar71 = 0;
    iVar65 = movmskps((int)uVar68,auVar268);
    if (iVar65 == 0) {
      iVar65 = 0;
      auVar179 = _DAT_01feba00;
      auVar227 = _DAT_01feb9f0;
    }
    else {
      auVar266 = sqrtps(auVar86,auVar250);
      bVar23 = 0.0 <= auVar250._0_4_;
      uVar79 = -(uint)bVar23;
      bVar78 = 0.0 <= auVar250._4_4_;
      uVar80 = -(uint)bVar78;
      bVar24 = 0.0 <= auVar250._8_4_;
      uVar81 = -(uint)bVar24;
      bVar25 = 0.0 <= auVar250._12_4_;
      uVar82 = -(uint)bVar25;
      auVar177._0_4_ = fVar281 + fVar281;
      auVar177._4_4_ = fVar282 + fVar282;
      auVar177._8_4_ = fVar289 + fVar289;
      auVar177._12_4_ = fVar290 + fVar290;
      auVar155 = rcpps(auVar226,auVar177);
      fVar301 = auVar155._0_4_;
      fVar303 = auVar155._4_4_;
      fVar310 = auVar155._8_4_;
      fVar311 = auVar155._12_4_;
      fVar301 = (1.0 - auVar177._0_4_ * fVar301) * fVar301 + fVar301;
      fVar303 = (1.0 - auVar177._4_4_ * fVar303) * fVar303 + fVar303;
      fVar310 = (1.0 - auVar177._8_4_ * fVar310) * fVar310 + fVar310;
      fVar311 = (1.0 - auVar177._12_4_ * fVar311) * fVar311 + fVar311;
      fVar291 = (-fVar242 - auVar266._0_4_) * fVar301;
      fVar292 = (-fVar252 - auVar266._4_4_) * fVar303;
      fVar299 = (-fVar253 - auVar266._8_4_) * fVar310;
      fVar300 = (-fVar261 - auVar266._12_4_) * fVar311;
      fVar301 = (auVar266._0_4_ - fVar242) * fVar301;
      fVar303 = (auVar266._4_4_ - fVar252) * fVar303;
      fVar310 = (auVar266._8_4_ - fVar253) * fVar310;
      fVar311 = (auVar266._12_4_ - fVar261) * fVar311;
      local_2c8._4_4_ = (fVar207 * fVar292 + fVar260) * (float)local_2f8._4_4_;
      local_2c8._0_4_ = (fVar206 * fVar291 + fVar259) * (float)local_2f8._0_4_;
      fStack_2c0 = (fVar208 * fVar299 + fVar273) * fStack_2f0;
      fStack_2bc = (fVar230 * fVar300 + fVar280) * fStack_2ec;
      local_2d8[0] = (fVar206 * fVar301 + fVar259) * (float)local_2f8._0_4_;
      local_2d8[1] = (fVar207 * fVar303 + fVar260) * (float)local_2f8._4_4_;
      local_2d8[2] = (fVar208 * fVar310 + fVar273) * fStack_2f0;
      local_2d8[3] = (fVar230 * fVar311 + fVar280) * fStack_2ec;
      auVar178._0_4_ = (uint)fVar291 & uVar79;
      auVar178._4_4_ = (uint)fVar292 & uVar80;
      auVar178._8_4_ = (uint)fVar299 & uVar81;
      auVar178._12_4_ = (uint)fVar300 & uVar82;
      auVar227._0_8_ = CONCAT44(~uVar80,~uVar79) & 0x7f8000007f800000;
      auVar227._8_4_ = ~uVar81 & 0x7f800000;
      auVar227._12_4_ = ~uVar82 & 0x7f800000;
      auVar227 = auVar227 | auVar178;
      auVar313._0_4_ = (uint)fVar301 & uVar79;
      auVar313._4_4_ = (uint)fVar303 & uVar80;
      auVar313._8_4_ = (uint)fVar310 & uVar81;
      auVar313._12_4_ = (uint)fVar311 & uVar82;
      auVar179._0_8_ = CONCAT44(~uVar80,~uVar79) & 0xff800000ff800000;
      auVar179._8_4_ = ~uVar81 & 0xff800000;
      auVar179._12_4_ = ~uVar82 & 0xff800000;
      auVar179 = auVar179 | auVar313;
      auVar257._0_4_ = (uint)fVar271 & auVar86._0_4_;
      auVar257._4_4_ = (uint)fVar272 & auVar86._4_4_;
      auVar257._8_4_ = (uint)fVar302 & auVar86._8_4_;
      auVar257._12_4_ = (uint)fVar254 & auVar86._12_4_;
      auVar41._4_4_ = uStack_2a4;
      auVar41._0_4_ = local_2a8;
      auVar41._8_4_ = uStack_2a0;
      auVar41._12_4_ = uStack_29c;
      auVar155 = maxps(auVar41,auVar257);
      fVar301 = auVar155._0_4_ * 1.9073486e-06;
      fVar303 = auVar155._4_4_ * 1.9073486e-06;
      fVar310 = auVar155._8_4_ * 1.9073486e-06;
      fVar311 = auVar155._12_4_ * 1.9073486e-06;
      fVar291 = (float)((uint)fVar281 & auVar86._0_4_);
      fVar292 = (float)((uint)fVar282 & auVar86._4_4_);
      fVar299 = (float)((uint)fVar289 & auVar86._8_4_);
      fVar300 = (float)((uint)fVar290 & auVar86._12_4_);
      auVar314._0_4_ = -(uint)(fVar291 < fVar301 && bVar23);
      auVar314._4_4_ = -(uint)(fVar292 < fVar303 && bVar78);
      auVar314._8_4_ = -(uint)(fVar299 < fVar310 && bVar24);
      auVar314._12_4_ = -(uint)(fVar300 < fVar311 && bVar25);
      iVar65 = movmskps(iVar65,auVar314);
      auVar86 = _DAT_01fec6c0;
      local_568 = auVar226;
      if (iVar65 != 0) {
        uVar79 = -(uint)(auVar226._0_4_ <= 0.0);
        uVar80 = -(uint)(auVar226._4_4_ <= 0.0);
        uVar81 = -(uint)(auVar226._8_4_ <= 0.0);
        uVar82 = -(uint)(auVar226._12_4_ <= 0.0);
        auVar298._0_4_ = (uVar79 & 0xff800000 | ~uVar79 & 0x7f800000) & auVar314._0_4_;
        auVar298._4_4_ = (uVar80 & 0xff800000 | ~uVar80 & 0x7f800000) & auVar314._4_4_;
        auVar298._8_4_ = (uVar81 & 0xff800000 | ~uVar81 & 0x7f800000) & auVar314._8_4_;
        auVar298._12_4_ = (uVar82 & 0xff800000 | ~uVar82 & 0x7f800000) & auVar314._12_4_;
        auVar204._0_4_ = ~auVar314._0_4_ & auVar227._0_4_;
        auVar204._4_4_ = ~auVar314._4_4_ & auVar227._4_4_;
        auVar204._8_4_ = ~auVar314._8_4_ & auVar227._8_4_;
        auVar204._12_4_ = ~auVar314._12_4_ & auVar227._12_4_;
        auVar227 = auVar204 | auVar298;
        auVar229._0_4_ = (uVar79 & 0x7f800000 | ~uVar79 & 0xff800000) & auVar314._0_4_;
        auVar229._4_4_ = (uVar80 & 0x7f800000 | ~uVar80 & 0xff800000) & auVar314._4_4_;
        auVar229._8_4_ = (uVar81 & 0x7f800000 | ~uVar81 & 0xff800000) & auVar314._8_4_;
        auVar229._12_4_ = (uVar82 & 0x7f800000 | ~uVar82 & 0xff800000) & auVar314._12_4_;
        auVar315._0_4_ = ~auVar314._0_4_ & auVar179._0_4_;
        auVar315._4_4_ = ~auVar314._4_4_ & auVar179._4_4_;
        auVar315._8_4_ = ~auVar314._8_4_ & auVar179._8_4_;
        auVar315._12_4_ = ~auVar314._12_4_ & auVar179._12_4_;
        auVar179 = auVar315 | auVar229;
        auVar268._0_4_ = -(uint)((fVar301 <= fVar291 || auVar226._0_4_ <= 0.0) && bVar23);
        auVar268._4_4_ = -(uint)((fVar303 <= fVar292 || auVar226._4_4_ <= 0.0) && bVar78);
        auVar268._8_4_ = -(uint)((fVar310 <= fVar299 || auVar226._8_4_ <= 0.0) && bVar24);
        auVar268._12_4_ = -(uint)((fVar311 <= fVar300 || auVar226._12_4_ <= 0.0) && bVar25);
        local_568 = auVar191;
      }
    }
    auVar269._0_4_ = (auVar268._0_4_ << 0x1f) >> 0x1f;
    auVar269._4_4_ = (auVar268._4_4_ << 0x1f) >> 0x1f;
    auVar269._8_4_ = (auVar268._8_4_ << 0x1f) >> 0x1f;
    auVar269._12_4_ = (auVar268._12_4_ << 0x1f) >> 0x1f;
    auVar269 = auVar269 & local_178;
    iVar65 = movmskps(iVar65,auVar269);
    uVar68 = uVar73;
    if (iVar65 != 0) {
      local_488._4_4_ = fVar151;
      local_488._0_4_ = fVar122;
      fStack_480 = fVar167;
      fStack_47c = fVar188;
      local_1a8 = fVar242;
      fStack_1a4 = fVar252;
      fStack_1a0 = fVar253;
      fStack_19c = fVar261;
      local_198 = fVar259;
      fStack_194 = fVar260;
      fStack_190 = fVar273;
      fStack_18c = fVar280;
      local_188 = fVar271;
      fStack_184 = fVar272;
      fStack_180 = fVar302;
      fStack_17c = fVar254;
      local_318 = fVar206;
      fStack_314 = fVar207;
      fStack_310 = fVar208;
      fStack_30c = fVar230;
      local_368._4_4_ = fVar282;
      local_368._0_4_ = fVar281;
      fStack_360 = fVar289;
      fStack_35c = fVar290;
      auVar251._0_4_ = (ray->super_RayK<1>).org.field_0.m128[3] - (float)local_2e8._0_4_;
      auVar251._4_4_ = auVar251._0_4_;
      auVar251._8_4_ = auVar251._0_4_;
      auVar251._12_4_ = auVar251._0_4_;
      auVar156 = maxps(auVar251,auVar227);
      auVar192._0_4_ = (ray->super_RayK<1>).tfar - (float)local_2e8._0_4_;
      auVar192._4_4_ = auVar192._0_4_;
      auVar192._8_4_ = auVar192._0_4_;
      auVar192._12_4_ = auVar192._0_4_;
      auVar266 = minps(auVar192,auVar179);
      auVar106._0_4_ = local_5a8 * local_3f8 + local_538 * local_348;
      auVar106._4_4_ = fStack_5a4 * fStack_3f4 + fStack_534 * fStack_344;
      auVar106._8_4_ = fStack_5a0 * fStack_3f0 + fStack_530 * fStack_340;
      auVar106._12_4_ = fStack_59c * fStack_3ec + fStack_52c * fStack_33c;
      auVar140._0_4_ = (float)local_588._0_4_ * local_358 + auVar106._0_4_;
      auVar140._4_4_ = local_598 * fStack_354 + auVar106._4_4_;
      auVar140._8_4_ = fStack_594 * fStack_350 + auVar106._8_4_;
      auVar140._12_4_ = fStack_590 * fStack_34c + auVar106._12_4_;
      auVar155 = rcpps(auVar106,auVar140);
      fVar291 = auVar155._0_4_;
      fVar292 = auVar155._4_4_;
      fVar299 = auVar155._8_4_;
      fVar300 = auVar155._12_4_;
      uVar85 = auVar86._0_4_;
      uVar123 = auVar86._4_4_;
      uVar125 = auVar86._8_4_;
      uVar126 = auVar86._12_4_;
      bVar23 = (float)((uint)auVar140._0_4_ & uVar85) < 1e-18;
      bVar78 = (float)((uint)auVar140._4_4_ & uVar123) < 1e-18;
      bVar24 = (float)((uint)auVar140._8_4_ & uVar125) < 1e-18;
      bVar25 = (float)((uint)auVar140._12_4_ & uVar126) < 1e-18;
      fVar84 = ((1.0 - auVar140._0_4_ * fVar291) * fVar291 + fVar291) *
               -(local_398 * (float)local_588._0_4_ + fVar84 * local_5a8 + local_3a8 * local_538);
      fVar127 = ((1.0 - auVar140._4_4_ * fVar292) * fVar292 + fVar292) *
                -(fStack_394 * local_598 + fVar127 * fStack_5a4 + fStack_3a4 * fStack_534);
      fVar153 = ((1.0 - auVar140._8_4_ * fVar299) * fVar299 + fVar299) *
                -(fStack_390 * fStack_594 + fVar153 * fStack_5a0 + fStack_3a0 * fStack_530);
      fVar187 = ((1.0 - auVar140._12_4_ * fVar300) * fVar300 + fVar300) *
                -(fStack_38c * fStack_590 + fVar187 * fStack_59c + fStack_39c * fStack_52c);
      uVar79 = -(uint)(auVar140._0_4_ < 0.0 || bVar23);
      uVar80 = -(uint)(auVar140._4_4_ < 0.0 || bVar78);
      uVar81 = -(uint)(auVar140._8_4_ < 0.0 || bVar24);
      uVar82 = -(uint)(auVar140._12_4_ < 0.0 || bVar25);
      auVar228._0_8_ = CONCAT44(uVar80,uVar79) & 0xff800000ff800000;
      auVar228._8_4_ = uVar81 & 0xff800000;
      auVar228._12_4_ = uVar82 & 0xff800000;
      auVar107._0_4_ = ~uVar79 & (uint)fVar84;
      auVar107._4_4_ = ~uVar80 & (uint)fVar127;
      auVar107._8_4_ = ~uVar81 & (uint)fVar153;
      auVar107._12_4_ = ~uVar82 & (uint)fVar187;
      auVar156 = maxps(auVar156,auVar107 | auVar228);
      uVar79 = -(uint)(0.0 < auVar140._0_4_ || bVar23);
      uVar80 = -(uint)(0.0 < auVar140._4_4_ || bVar78);
      uVar81 = -(uint)(0.0 < auVar140._8_4_ || bVar24);
      uVar82 = -(uint)(0.0 < auVar140._12_4_ || bVar25);
      auVar108._0_8_ = CONCAT44(uVar80,uVar79) & 0x7f8000007f800000;
      auVar108._8_4_ = uVar81 & 0x7f800000;
      auVar108._12_4_ = uVar82 & 0x7f800000;
      auVar141._0_4_ = ~uVar79 & (uint)fVar84;
      auVar141._4_4_ = ~uVar80 & (uint)fVar127;
      auVar141._8_4_ = ~uVar81 & (uint)fVar153;
      auVar141._12_4_ = ~uVar82 & (uint)fVar187;
      auVar266 = minps(auVar266,auVar141 | auVar108);
      auVar142._0_4_ = (0.0 - fStack_4e4) * -fStack_5a4 + (0.0 - fVar232) * -fStack_534;
      auVar142._4_4_ = (0.0 - fStack_4e0) * -fStack_5a0 + (0.0 - fVar238) * -fStack_530;
      auVar142._8_4_ = (0.0 - fStack_4dc) * -fStack_59c + (0.0 - fVar239) * -fStack_52c;
      auVar142._12_4_ = 0x80000000;
      auVar304._0_4_ = -local_598 * local_358 + -fStack_5a4 * local_3f8 + -fStack_534 * local_348;
      auVar304._4_4_ =
           -fStack_594 * fStack_354 + -fStack_5a0 * fStack_3f4 + -fStack_530 * fStack_344;
      auVar304._8_4_ =
           -fStack_590 * fStack_350 + -fStack_59c * fStack_3f0 + -fStack_52c * fStack_340;
      auVar304._12_4_ = fStack_34c * -0.0 + fStack_3ec * -0.0 + fStack_33c * -0.0;
      auVar155 = rcpps(auVar142,auVar304);
      fVar84 = auVar155._0_4_;
      fVar127 = auVar155._4_4_;
      fVar153 = auVar155._8_4_;
      fVar187 = auVar155._12_4_;
      bVar23 = (float)((uint)auVar304._0_4_ & uVar85) < 1e-18;
      bVar78 = (float)((uint)auVar304._4_4_ & uVar123) < 1e-18;
      bVar24 = (float)((uint)auVar304._8_4_ & uVar125) < 1e-18;
      bVar25 = (float)((uint)auVar304._12_4_ & uVar126) < 1e-18;
      fVar84 = (((float)DAT_01feca10 - auVar304._0_4_ * fVar84) * fVar84 + fVar84) *
               -((0.0 - fStack_4f4) * -local_598 + auVar142._0_4_);
      fVar127 = ((DAT_01feca10._4_4_ - auVar304._4_4_ * fVar127) * fVar127 + fVar127) *
                -((0.0 - fStack_4f0) * -fStack_594 + auVar142._4_4_);
      fVar153 = ((DAT_01feca10._8_4_ - auVar304._8_4_ * fVar153) * fVar153 + fVar153) *
                -((0.0 - fStack_4ec) * -fStack_590 + auVar142._8_4_);
      fVar187 = ((DAT_01feca10._12_4_ - auVar304._12_4_ * fVar187) * fVar187 + fVar187) * 0.0;
      uVar79 = -(uint)(auVar304._0_4_ < 0.0 || bVar23);
      uVar80 = -(uint)(auVar304._4_4_ < 0.0 || bVar78);
      uVar81 = -(uint)(auVar304._8_4_ < 0.0 || bVar24);
      uVar82 = -(uint)(auVar304._12_4_ < 0.0 || bVar25);
      auVar143._0_8_ = CONCAT44(uVar80,uVar79) & 0xff800000ff800000;
      auVar143._8_4_ = uVar81 & 0xff800000;
      auVar143._12_4_ = uVar82 & 0xff800000;
      auVar109._0_4_ = ~uVar79 & (uint)fVar84;
      auVar109._4_4_ = ~uVar80 & (uint)fVar127;
      auVar109._8_4_ = ~uVar81 & (uint)fVar153;
      auVar109._12_4_ = ~uVar82 & (uint)fVar187;
      local_3d8 = maxps(auVar156,auVar109 | auVar143);
      uVar79 = -(uint)(0.0 < auVar304._0_4_ || bVar23);
      uVar80 = -(uint)(0.0 < auVar304._4_4_ || bVar78);
      uVar81 = -(uint)(0.0 < auVar304._8_4_ || bVar24);
      uVar82 = -(uint)(0.0 < auVar304._12_4_ || bVar25);
      auVar110._0_8_ = CONCAT44(uVar80,uVar79) & 0x7f8000007f800000;
      auVar110._8_4_ = uVar81 & 0x7f800000;
      auVar110._12_4_ = uVar82 & 0x7f800000;
      auVar305._0_4_ = ~uVar79 & (uint)fVar84;
      auVar305._4_4_ = ~uVar80 & (uint)fVar127;
      auVar305._8_4_ = ~uVar81 & (uint)fVar153;
      auVar305._12_4_ = ~uVar82 & (uint)fVar187;
      _local_588 = minps(auVar266,auVar305 | auVar110);
      fVar84 = local_3d8._12_4_;
      fVar127 = local_3d8._0_4_;
      fVar153 = local_3d8._4_4_;
      fVar187 = local_3d8._8_4_;
      auVar288._0_4_ = -(uint)(fVar127 <= local_588._0_4_) & auVar269._0_4_;
      auVar288._4_4_ = -(uint)(fVar153 <= local_588._4_4_) & auVar269._4_4_;
      auVar288._8_4_ = -(uint)(fVar187 <= local_588._8_4_) & auVar269._8_4_;
      auVar288._12_4_ = -(uint)(fVar84 <= local_588._12_4_) & auVar269._12_4_;
      iVar65 = movmskps(iVar65,auVar288);
      local_568 = auVar191;
      if (iVar65 != 0) {
        auVar155 = maxps(ZEXT816(0),_local_5e8);
        auVar266 = minps(_local_2c8,_DAT_01feca10);
        auVar235._0_12_ = ZEXT812(0);
        auVar235._12_4_ = 0;
        auVar266 = maxps(auVar266,auVar235);
        auVar40._4_4_ = local_2d8[1];
        auVar40._0_4_ = local_2d8[0];
        auVar40._8_4_ = local_2d8[2];
        auVar40._12_4_ = local_2d8[3];
        auVar156 = minps(auVar40,_DAT_01feca10);
        auVar156 = maxps(auVar156,auVar235);
        local_2c8._0_4_ = (auVar266._0_4_ + 0.0) * (float)DAT_01ff1da0 * local_3b8 + fVar168;
        local_2c8._4_4_ = (auVar266._4_4_ + 1.0) * DAT_01ff1da0._4_4_ * local_3b8 + fVar168;
        fStack_2c0 = (auVar266._8_4_ + 2.0) * DAT_01ff1da0._8_4_ * local_3b8 + fVar168;
        fStack_2bc = (auVar266._12_4_ + 3.0) * DAT_01ff1da0._12_4_ * local_3b8 + fVar168;
        local_2d8[0] = (auVar156._0_4_ + 0.0) * (float)DAT_01ff1da0 * local_3b8 + fVar168;
        local_2d8[1] = (auVar156._4_4_ + 1.0) * DAT_01ff1da0._4_4_ * local_3b8 + fVar168;
        local_2d8[2] = (auVar156._8_4_ + 2.0) * DAT_01ff1da0._8_4_ * local_3b8 + fVar168;
        local_2d8[3] = (auVar156._12_4_ + 3.0) * DAT_01ff1da0._12_4_ * local_3b8 + fVar168;
        fVar124 = fVar124 - auVar155._0_4_ * auVar155._0_4_;
        fVar152 = fVar152 - auVar155._4_4_ * auVar155._4_4_;
        fVar169 = fVar169 - auVar155._8_4_ * auVar155._8_4_;
        fVar189 = fVar189 - auVar155._12_4_ * auVar155._12_4_;
        local_568._0_4_ = auVar191._0_4_ - fVar122 * fVar124;
        local_568._4_4_ = auVar191._4_4_ - fVar151 * fVar152;
        local_568._8_4_ = auVar191._8_4_ - fVar167 * fVar169;
        local_568._12_4_ = auVar191._12_4_ - fVar188 * fVar189;
        local_308._4_4_ = -(uint)(0.0 <= local_568._4_4_);
        local_308._0_4_ = -(uint)(0.0 <= local_568._0_4_);
        local_308._8_4_ = -(uint)(0.0 <= local_568._8_4_);
        local_308._12_4_ = -(uint)(0.0 <= local_568._12_4_);
        iVar65 = movmskps(iVar65,local_308);
        if (iVar65 == 0) {
          fVar261 = 0.0;
          fVar259 = 0.0;
          fVar260 = 0.0;
          fVar273 = 0.0;
          fVar206 = 0.0;
          fVar207 = 0.0;
          fVar208 = 0.0;
          fVar230 = 0.0;
          fVar231 = 0.0;
          fVar232 = 0.0;
          fVar238 = 0.0;
          fVar239 = 0.0;
          fVar168 = 0.0;
          fVar122 = 0.0;
          fVar151 = 0.0;
          fVar167 = 0.0;
          fVar188 = 0.0;
          fVar242 = 0.0;
          fVar252 = 0.0;
          fVar253 = 0.0;
          _local_488 = ZEXT816(0);
          iVar65 = 0;
          auVar237 = _DAT_01feba00;
          auVar258 = _DAT_01feb9f0;
          local_568 = auVar191;
        }
        else {
          auVar266 = sqrtps(_DAT_01ff1da0,local_568);
          auVar144._0_4_ = fVar281 + fVar281;
          auVar144._4_4_ = fVar282 + fVar282;
          auVar144._8_4_ = fVar289 + fVar289;
          auVar144._12_4_ = fVar290 + fVar290;
          auVar155 = rcpps(_local_2c8,auVar144);
          fVar300 = auVar155._0_4_;
          fVar301 = auVar155._4_4_;
          fVar303 = auVar155._8_4_;
          fVar310 = auVar155._12_4_;
          fVar300 = ((float)DAT_01feca10 - auVar144._0_4_ * fVar300) * fVar300 + fVar300;
          fVar301 = (DAT_01feca10._4_4_ - auVar144._4_4_ * fVar301) * fVar301 + fVar301;
          fVar303 = (DAT_01feca10._8_4_ - auVar144._8_4_ * fVar303) * fVar303 + fVar303;
          fVar310 = (DAT_01feca10._12_4_ - auVar144._12_4_ * fVar310) * fVar310 + fVar310;
          fVar311 = (-fVar242 - auVar266._0_4_) * fVar300;
          fVar312 = (-fVar252 - auVar266._4_4_) * fVar301;
          fVar240 = (-fVar253 - auVar266._8_4_) * fVar303;
          fVar241 = (-fVar261 - auVar266._12_4_) * fVar310;
          fVar300 = (auVar266._0_4_ - fVar242) * fVar300;
          fVar301 = (auVar266._4_4_ - fVar252) * fVar301;
          fVar303 = (auVar266._8_4_ - fVar253) * fVar303;
          fVar310 = (auVar266._12_4_ - fVar261) * fVar310;
          fVar261 = (fVar206 * fVar311 + fVar259) * (float)local_2f8._0_4_;
          fVar291 = (fVar207 * fVar312 + fVar260) * (float)local_2f8._4_4_;
          fVar292 = (fVar208 * fVar240 + fVar273) * fStack_2f0;
          fVar299 = (fVar230 * fVar241 + fVar280) * fStack_2ec;
          fVar168 = local_358 * fVar311 - ((float)local_428._0_4_ * fVar261 + local_4f8);
          fVar122 = fStack_354 * fVar312 - ((float)local_428._4_4_ * fVar291 + fStack_4f4);
          fVar151 = fStack_350 * fVar240 - (fStack_420 * fVar292 + fStack_4f0);
          fVar167 = fStack_34c * fVar241 - (fStack_41c * fVar299 + fStack_4ec);
          local_518._4_4_ = fVar122;
          local_518._0_4_ = fVar168;
          fStack_510 = fVar151;
          fStack_50c = fVar167;
          fVar188 = local_3f8 * fVar311 - ((float)local_508._0_4_ * fVar261 + local_4e8);
          fVar242 = fStack_3f4 * fVar312 - ((float)local_508._4_4_ * fVar291 + fStack_4e4);
          fVar252 = fStack_3f0 * fVar240 - (fStack_500 * fVar292 + fStack_4e0);
          fVar253 = fStack_3ec * fVar241 - (fStack_4fc * fVar299 + fStack_4dc);
          local_488._4_4_ = fStack_344 * fVar312 - (fVar291 * (float)local_418._4_4_ + fVar232);
          local_488._0_4_ = local_348 * fVar311 - (fVar261 * (float)local_418._0_4_ + fVar231);
          fStack_480 = fStack_340 * fVar240 - (fVar292 * fStack_410 + fVar238);
          fStack_47c = fStack_33c * fVar241 - (fVar299 * fStack_40c + fVar239);
          fVar291 = (fVar206 * fVar300 + fVar259) * (float)local_2f8._0_4_;
          fVar292 = (fVar207 * fVar301 + fVar260) * (float)local_2f8._4_4_;
          fVar299 = (fVar208 * fVar303 + fVar273) * fStack_2f0;
          fVar280 = (fVar230 * fVar310 + fVar280) * fStack_2ec;
          fVar261 = local_358 * fVar300 - ((float)local_428._0_4_ * fVar291 + local_4f8);
          fVar259 = fStack_354 * fVar301 - ((float)local_428._4_4_ * fVar292 + fStack_4f4);
          fVar260 = fStack_350 * fVar303 - (fStack_420 * fVar299 + fStack_4f0);
          fVar273 = fStack_34c * fVar310 - (fStack_41c * fVar280 + fStack_4ec);
          fVar206 = local_3f8 * fVar300 - ((float)local_508._0_4_ * fVar291 + local_4e8);
          fVar207 = fStack_3f4 * fVar301 - ((float)local_508._4_4_ * fVar292 + fStack_4e4);
          fVar208 = fStack_3f0 * fVar303 - (fStack_500 * fVar299 + fStack_4e0);
          fVar230 = fStack_3ec * fVar310 - (fStack_4fc * fVar280 + fStack_4dc);
          bVar23 = 0.0 <= local_568._0_4_;
          uVar79 = -(uint)bVar23;
          bVar78 = 0.0 <= local_568._4_4_;
          uVar80 = -(uint)bVar78;
          bVar24 = 0.0 <= local_568._8_4_;
          uVar81 = -(uint)bVar24;
          bVar25 = 0.0 <= local_568._12_4_;
          uVar82 = -(uint)bVar25;
          fVar231 = local_348 * fVar300 - (fVar291 * (float)local_418._0_4_ + fVar231);
          fVar232 = fStack_344 * fVar301 - (fVar292 * (float)local_418._4_4_ + fVar232);
          fVar238 = fStack_340 * fVar303 - (fVar299 * fStack_410 + fVar238);
          fVar239 = fStack_33c * fVar310 - (fVar280 * fStack_40c + fVar239);
          auVar236._0_4_ = (uint)fVar311 & uVar79;
          auVar236._4_4_ = (uint)fVar312 & uVar80;
          auVar236._8_4_ = (uint)fVar240 & uVar81;
          auVar236._12_4_ = (uint)fVar241 & uVar82;
          auVar258._0_8_ = CONCAT44(~uVar80,~uVar79) & 0x7f8000007f800000;
          auVar258._8_4_ = ~uVar81 & 0x7f800000;
          auVar258._12_4_ = ~uVar82 & 0x7f800000;
          auVar258 = auVar258 | auVar236;
          auVar193._0_4_ = (uint)fVar300 & uVar79;
          auVar193._4_4_ = (uint)fVar301 & uVar80;
          auVar193._8_4_ = (uint)fVar303 & uVar81;
          auVar193._12_4_ = (uint)fVar310 & uVar82;
          auVar237._0_8_ = CONCAT44(~uVar80,~uVar79) & 0xff800000ff800000;
          auVar237._8_4_ = ~uVar81 & 0xff800000;
          auVar237._12_4_ = ~uVar82 & 0xff800000;
          auVar237 = auVar237 | auVar193;
          auVar111._0_4_ = (uint)fVar271 & uVar85;
          auVar111._4_4_ = (uint)fVar272 & uVar123;
          auVar111._8_4_ = (uint)fVar302 & uVar125;
          auVar111._12_4_ = (uint)fVar254 & uVar126;
          auVar42._4_4_ = uStack_2a4;
          auVar42._0_4_ = local_2a8;
          auVar42._8_4_ = uStack_2a0;
          auVar42._12_4_ = uStack_29c;
          auVar155 = maxps(auVar42,auVar111);
          fVar271 = auVar155._0_4_ * 1.9073486e-06;
          fVar272 = auVar155._4_4_ * 1.9073486e-06;
          fVar302 = auVar155._8_4_ * 1.9073486e-06;
          fVar254 = auVar155._12_4_ * 1.9073486e-06;
          auVar194._0_4_ = -(uint)((float)((uint)fVar281 & uVar85) < fVar271 && bVar23);
          auVar194._4_4_ = -(uint)((float)((uint)fVar282 & uVar123) < fVar272 && bVar78);
          auVar194._8_4_ = -(uint)((float)((uint)fVar289 & uVar125) < fVar302 && bVar24);
          auVar194._12_4_ = -(uint)((float)((uint)fVar290 & uVar126) < fVar254 && bVar25);
          iVar65 = movmskps(iVar65,auVar194);
          if (iVar65 != 0) {
            uVar79 = -(uint)(fVar124 <= 0.0);
            uVar80 = -(uint)(fVar152 <= 0.0);
            uVar81 = -(uint)(fVar169 <= 0.0);
            uVar82 = -(uint)(fVar189 <= 0.0);
            auVar278._0_4_ = (uVar79 & 0xff800000 | ~uVar79 & 0x7f800000) & auVar194._0_4_;
            auVar278._4_4_ = (uVar80 & 0xff800000 | ~uVar80 & 0x7f800000) & auVar194._4_4_;
            auVar278._8_4_ = (uVar81 & 0xff800000 | ~uVar81 & 0x7f800000) & auVar194._8_4_;
            auVar278._12_4_ = (uVar82 & 0xff800000 | ~uVar82 & 0x7f800000) & auVar194._12_4_;
            auVar270._0_4_ = ~auVar194._0_4_ & auVar258._0_4_;
            auVar270._4_4_ = ~auVar194._4_4_ & auVar258._4_4_;
            auVar270._8_4_ = ~auVar194._8_4_ & auVar258._8_4_;
            auVar270._12_4_ = ~auVar194._12_4_ & auVar258._12_4_;
            auVar258 = auVar270 | auVar278;
            auVar279._0_4_ = (uVar79 & 0x7f800000 | ~uVar79 & 0xff800000) & auVar194._0_4_;
            auVar279._4_4_ = (uVar80 & 0x7f800000 | ~uVar80 & 0xff800000) & auVar194._4_4_;
            auVar279._8_4_ = (uVar81 & 0x7f800000 | ~uVar81 & 0xff800000) & auVar194._8_4_;
            auVar279._12_4_ = (uVar82 & 0x7f800000 | ~uVar82 & 0xff800000) & auVar194._12_4_;
            auVar205._0_4_ = ~auVar194._0_4_ & auVar237._0_4_;
            auVar205._4_4_ = ~auVar194._4_4_ & auVar237._4_4_;
            auVar205._8_4_ = ~auVar194._8_4_ & auVar237._8_4_;
            auVar205._12_4_ = ~auVar194._12_4_ & auVar237._12_4_;
            auVar237 = auVar205 | auVar279;
            local_308._4_4_ =
                 -(uint)((fVar272 <= (float)((uint)fVar282 & uVar123) || fVar152 <= 0.0) && bVar78);
            local_308._0_4_ =
                 -(uint)((fVar271 <= (float)((uint)fVar281 & uVar85) || fVar124 <= 0.0) && bVar23);
            local_308._8_4_ =
                 -(uint)((fVar302 <= (float)((uint)fVar289 & uVar125) || fVar169 <= 0.0) && bVar24);
            local_308._12_4_ =
                 -(uint)((fVar254 <= (float)((uint)fVar290 & uVar126) || fVar189 <= 0.0) && bVar25);
          }
        }
        fVar124 = (ray->super_RayK<1>).dir.field_0.m128[0];
        fVar152 = (ray->super_RayK<1>).dir.field_0.m128[1];
        fVar169 = (ray->super_RayK<1>).dir.field_0.m128[2];
        local_418._4_4_ =
             -(uint)(0.3 <= (float)((uint)(fVar259 * fVar124 + fVar207 * fVar152 + fVar232 * fVar169
                                          ) & uVar123));
        local_418._0_4_ =
             -(uint)(0.3 <= (float)((uint)(fVar261 * fVar124 + fVar206 * fVar152 + fVar231 * fVar169
                                          ) & uVar85));
        fStack_410 = (float)-(uint)(0.3 <= (float)((uint)(fVar260 * fVar124 +
                                                         fVar208 * fVar152 + fVar238 * fVar169) &
                                                  uVar125));
        fStack_40c = (float)-(uint)(0.3 <= (float)((uint)(fVar273 * fVar124 +
                                                         fVar230 * fVar152 + fVar239 * fVar169) &
                                                  uVar126));
        _local_118 = local_3d8;
        local_108 = minps(_local_588,auVar258);
        _local_1d8 = maxps(local_3d8,auVar237);
        local_1c8 = _local_588;
        local_328._0_4_ = -(uint)(fVar127 <= local_108._0_4_) & auVar288._0_4_;
        local_328._4_4_ = -(uint)(fVar153 <= local_108._4_4_) & auVar288._4_4_;
        local_328._8_4_ = -(uint)(fVar187 <= local_108._8_4_) & auVar288._8_4_;
        local_328._12_4_ = -(uint)(fVar84 <= local_108._12_4_) & auVar288._12_4_;
        _local_428 = _local_1d8;
        local_338._0_8_ =
             CONCAT44(-(uint)(local_1d8._4_4_ <= local_588._4_4_) & auVar288._4_4_,
                      -(uint)(local_1d8._0_4_ <= local_588._0_4_) & auVar288._0_4_);
        local_338._8_4_ = -(uint)(local_1d8._8_4_ <= local_588._8_4_) & auVar288._8_4_;
        local_338._12_4_ = -(uint)(local_1d8._12_4_ <= local_588._12_4_) & auVar288._12_4_;
        auVar112._8_4_ = local_338._8_4_;
        auVar112._0_8_ = local_338._0_8_;
        auVar112._12_4_ = local_338._12_4_;
        iVar65 = movmskps(iVar65,auVar112 | local_328);
        if (iVar65 != 0) {
          _local_368 = local_338;
          local_318 = (float)local_490;
          fStack_314 = (float)local_490;
          fStack_310 = (float)local_490;
          fStack_30c = (float)local_490;
          local_488._0_4_ =
               -(uint)((int)(float)local_490 <
                      ((int)((-(uint)(0.3 <= (float)((uint)((float)local_488._0_4_ * fVar169 +
                                                            fVar188 * fVar152 + fVar168 * fVar124) &
                                                    uVar85)) & local_308._0_4_) << 0x1f) >> 0x1f) +
                      4);
          local_488._4_4_ =
               -(uint)((int)(float)local_490 <
                      ((int)((-(uint)(0.3 <= (float)((uint)((float)local_488._4_4_ * fVar169 +
                                                            fVar242 * fVar152 + fVar122 * fVar124) &
                                                    uVar123)) & local_308._4_4_) << 0x1f) >> 0x1f) +
                      4);
          fStack_480 = (float)-(uint)((int)(float)local_490 <
                                     ((int)((-(uint)(0.3 <= (float)((uint)(fStack_480 * fVar169 +
                                                                           fVar252 * fVar152 +
                                                                          fVar151 * fVar124) &
                                                                   uVar125)) & local_308._8_4_) <<
                                           0x1f) >> 0x1f) + 4);
          fStack_47c = (float)-(uint)((int)(float)local_490 <
                                     ((int)((-(uint)(0.3 <= (float)((uint)(fStack_47c * fVar169 +
                                                                           fVar253 * fVar152 +
                                                                          fVar167 * fVar124) &
                                                                   uVar126)) & local_308._12_4_) <<
                                           0x1f) >> 0x1f) + 4);
          _local_2f8 = local_328;
          local_328 = ~_local_488 & local_328;
          iVar65 = movmskps(iVar65,local_328);
          if (iVar65 != 0) {
            local_3e8 = local_3c8 + fVar127;
            fStack_3e4 = fStack_3c4 + fVar153;
            fStack_3e0 = fStack_3c0 + fVar187;
            fStack_3dc = fStack_3bc + fVar84;
            do {
              auVar266 = ~local_328 & _DAT_01feb9f0 | local_328 & local_3d8;
              auVar180._4_4_ = auVar266._0_4_;
              auVar180._0_4_ = auVar266._4_4_;
              auVar180._8_4_ = auVar266._12_4_;
              auVar180._12_4_ = auVar266._8_4_;
              auVar155 = minps(auVar180,auVar266);
              auVar145._0_8_ = auVar155._8_8_;
              auVar145._8_4_ = auVar155._0_4_;
              auVar145._12_4_ = auVar155._4_4_;
              auVar155 = minps(auVar145,auVar155);
              auVar146._0_8_ =
                   CONCAT44(-(uint)(auVar155._4_4_ == auVar266._4_4_) & local_328._4_4_,
                            -(uint)(auVar155._0_4_ == auVar266._0_4_) & local_328._0_4_);
              auVar146._8_4_ = -(uint)(auVar155._8_4_ == auVar266._8_4_) & local_328._8_4_;
              auVar146._12_4_ = -(uint)(auVar155._12_4_ == auVar266._12_4_) & local_328._12_4_;
              iVar65 = movmskps(iVar65,auVar146);
              auVar113 = local_328;
              if (iVar65 != 0) {
                auVar113._8_4_ = auVar146._8_4_;
                auVar113._0_8_ = auVar146._0_8_;
                auVar113._12_4_ = auVar146._12_4_;
              }
              uVar66 = movmskps(iVar65,auVar113);
              pRVar69 = (RayHit *)0x0;
              if (CONCAT44(uVar71,uVar66) != 0) {
                for (; (CONCAT44(uVar71,uVar66) >> (long)pRVar69 & 1) == 0;
                    pRVar69 = (RayHit *)((long)(pRVar69->super_RayK<1>).org.field_0.m128 + 1)) {
                }
              }
              *(undefined4 *)(local_328 + (long)pRVar69 * 4) = 0;
              fVar168 = *(float *)(local_2c8 + (long)pRVar69 * 4);
              fVar84 = *(float *)(local_118 + (long)pRVar69 * 4);
              local_4f8 = (ray->super_RayK<1>).dir.field_0.m128[0];
              fStack_4f4 = (ray->super_RayK<1>).dir.field_0.m128[1];
              fStack_4f0 = (ray->super_RayK<1>).dir.field_0.m128[2];
              fStack_4ec = (ray->super_RayK<1>).dir.field_0.m128[3];
              fVar122 = fStack_4f0 * fStack_4f0 + fStack_4f4 * fStack_4f4 + local_4f8 * local_4f8;
              if (fVar122 < 0.0) {
                fVar122 = sqrtf(fVar122);
                pRVar69 = extraout_RAX;
                auVar86 = _DAT_01fec6c0;
              }
              else {
                fVar122 = SQRT(fVar122);
              }
              auVar32._4_4_ = fStack_4d4;
              auVar32._0_4_ = local_4d8;
              auVar32._8_4_ = fStack_4d0;
              auVar32._12_4_ = fStack_4cc;
              auVar36._4_4_ = fStack_464;
              auVar36._0_4_ = local_468;
              auVar36._8_4_ = fStack_460;
              auVar36._12_4_ = fStack_45c;
              auVar266 = minps(auVar32,auVar36);
              auVar156 = maxps(auVar32,auVar36);
              auVar34._4_4_ = fStack_474;
              auVar34._0_4_ = local_478;
              auVar34._8_4_ = fStack_470;
              auVar34._12_4_ = fStack_46c;
              auVar155 = minps(auVar34,_local_548);
              auVar266 = minps(auVar266,auVar155);
              auVar155 = maxps(auVar34,_local_548);
              auVar155 = maxps(auVar156,auVar155);
              auVar195._0_4_ = auVar266._0_4_ & auVar86._0_4_;
              auVar195._4_4_ = auVar266._4_4_ & auVar86._4_4_;
              auVar195._8_4_ = auVar266._8_4_ & auVar86._8_4_;
              auVar195._12_4_ = auVar266._12_4_ & auVar86._12_4_;
              local_3b8 = auVar155._12_4_;
              auVar114._0_4_ = auVar155._0_4_ & auVar86._0_4_;
              auVar114._4_4_ = auVar155._4_4_ & auVar86._4_4_;
              auVar114._8_4_ = auVar155._8_4_ & auVar86._8_4_;
              auVar114._12_4_ = (uint)local_3b8 & auVar86._12_4_;
              auVar86 = maxps(auVar195,auVar114);
              fVar124 = auVar86._4_4_;
              if (auVar86._4_4_ <= auVar86._0_4_) {
                fVar124 = auVar86._0_4_;
              }
              auVar196._8_8_ = auVar86._8_8_;
              auVar196._0_8_ = auVar86._8_8_;
              if (auVar86._8_4_ <= fVar124) {
                auVar196._0_4_ = fVar124;
              }
              register0x00001304 = auVar196._4_12_;
              local_508._0_4_ = auVar196._0_4_ * 1.9073486e-06;
              local_398 = fVar122 * 1.9073486e-06;
              fStack_3b4 = local_3b8;
              fStack_3b0 = local_3b8;
              fStack_3ac = local_3b8;
              lVar77 = 4;
              do {
                fVar167 = 1.0 - fVar168;
                local_558 = ZEXT416((uint)fVar167);
                local_588._4_4_ = fVar168 * fVar167;
                fVar152 = fVar167 * fVar167 * fVar167;
                local_588._0_4_ = fVar167 * fVar167;
                fStack_580 = fVar167 * 0.0;
                fStack_57c = fVar167 * 0.0;
                fVar122 = fVar168 * fVar168;
                fVar169 = (float)local_588._4_4_ * fVar168;
                fVar124 = fVar168 * fVar122;
                fVar151 = (fVar169 * 12.0 + fVar167 * (float)local_588._4_4_ * 6.0 +
                          fVar124 * 4.0 + fVar152) * 0.16666667;
                fVar127 = fVar124 * 0.16666667;
                fVar153 = fVar152 * 0.16666667;
                fVar124 = (fVar167 * (float)local_588._4_4_ * 12.0 + fVar169 * 6.0 +
                          fVar152 * 4.0 + fVar124) * 0.16666667;
                local_518._0_4_ =
                     fVar153 * local_4d8 +
                     fVar124 * local_468 + fVar151 * local_478 + fVar127 * (float)local_548._0_4_;
                local_518._4_4_ =
                     fVar153 * fStack_4d4 +
                     fVar124 * fStack_464 + fVar151 * fStack_474 + fVar127 * (float)local_548._4_4_;
                fStack_510 = fVar153 * fStack_4d0 +
                             fVar124 * fStack_460 + fVar151 * fStack_470 + fVar127 * fStack_540;
                fStack_50c = fVar153 * fStack_4cc +
                             fVar124 * fStack_45c + fVar151 * fStack_46c + fVar127 * fStack_53c;
                local_4e8 = (fVar84 * local_4f8 + 0.0) - (float)local_518._0_4_;
                fStack_4e4 = (fVar84 * fStack_4f4 + 0.0) - (float)local_518._4_4_;
                fStack_4e0 = (fVar84 * fStack_4f0 + 0.0) - fStack_510;
                fStack_4dc = (fVar84 * fStack_4ec + 0.0) - fStack_50c;
                fVar124 = fStack_4e4 * fStack_4e4;
                fVar127 = fStack_4e0 * fStack_4e0;
                fVar151 = fStack_4dc * fStack_4dc;
                fVar152 = fVar124 + local_4e8 * local_4e8 + fVar127;
                fVar153 = fVar124 + fVar124 + fVar151;
                fVar127 = fVar124 + fVar127 + fVar127;
                fVar151 = fVar124 + fVar151 + fVar151;
                local_388 = fVar152;
                if (fVar152 < 0.0) {
                  local_5a8 = fVar122;
                  fStack_5a4 = fVar169;
                  fStack_5a0 = fVar167 * 0.0 * fVar168;
                  fStack_59c = fVar167 * 0.0 * fVar168;
                  local_598 = fVar168;
                  fStack_594 = fVar168;
                  fStack_590 = fVar168;
                  fStack_58c = fVar168;
                  fVar206 = sqrtf(fVar152);
                  fVar124 = local_558._0_4_;
                  pRVar70 = extraout_RAX_00;
                  fVar122 = local_5a8;
                  fVar169 = local_598;
                  fVar187 = fStack_594;
                  fVar188 = fStack_590;
                  fVar189 = fStack_58c;
                }
                else {
                  fVar206 = SQRT(fVar152);
                  pRVar70 = pRVar69;
                  fVar169 = fVar168;
                  fVar187 = fVar168;
                  fVar188 = fVar168;
                  fVar189 = fVar168;
                  fVar124 = fVar167;
                }
                fVar230 = -fVar124 * fVar124 * 0.5;
                fVar207 = (-fVar168 * fVar168 - (float)local_588._4_4_ * 4.0) * 0.5;
                fVar208 = (fVar124 * fVar124 + (float)local_588._4_4_ * 4.0) * 0.5;
                fVar122 = fVar122 * 0.5;
                local_588._0_4_ =
                     fVar230 * local_4d8 +
                     fVar207 * local_468 + fVar208 * local_478 + fVar122 * (float)local_548._0_4_;
                local_588._4_4_ =
                     fVar230 * fStack_4d4 +
                     fVar207 * fStack_464 + fVar208 * fStack_474 + fVar122 * (float)local_548._4_4_;
                fStack_580 = fVar230 * fStack_4d0 +
                             fVar207 * fStack_460 + fVar208 * fStack_470 + fVar122 * fStack_540;
                fStack_57c = fVar230 * fStack_4cc +
                             fVar207 * fStack_45c + fVar208 * fStack_46c + fVar122 * fStack_53c;
                fVar122 = fVar168 - (fVar124 + fVar124);
                fVar124 = fVar124 - (fVar168 + fVar168);
                fVar169 = fVar167 * local_4d8 +
                          fVar122 * local_468 +
                          fVar124 * local_478 + fVar169 * (float)local_548._0_4_;
                fVar187 = fVar167 * fStack_4d4 +
                          fVar122 * fStack_464 +
                          fVar124 * fStack_474 + fVar187 * (float)local_548._4_4_;
                fVar188 = fVar167 * fStack_4d0 +
                          fVar122 * fStack_460 + fVar124 * fStack_470 + fVar188 * fStack_540;
                local_558._0_4_ = local_508._0_4_;
                if ((float)local_508._0_4_ <= local_398 * fVar84) {
                  local_558._0_4_ = local_398 * fVar84;
                }
                fVar207 = (float)local_588._4_4_ * (float)local_588._4_4_ +
                          (float)local_588._0_4_ * (float)local_588._0_4_ + fStack_580 * fStack_580;
                auVar155 = ZEXT416((uint)fVar207);
                auVar86 = rsqrtss(ZEXT416((uint)fVar207),auVar155);
                fVar208 = auVar86._0_4_;
                fVar208 = fVar208 * fVar208 * fVar207 * -0.5 * fVar208 + fVar208 * 1.5;
                fVar230 = fVar188 * fStack_580 +
                          fVar187 * (float)local_588._4_4_ + fVar169 * (float)local_588._0_4_;
                auVar86 = rcpss(auVar155,auVar155);
                fVar231 = (2.0 - fVar207 * auVar86._0_4_) * auVar86._0_4_;
                local_538 = fVar231 * (fVar207 * fVar169 - fVar230 * (float)local_588._0_4_) *
                            fVar208;
                fStack_534 = fVar231 * (fVar207 * fVar187 - fVar230 * (float)local_588._4_4_) *
                             fVar208;
                fStack_530 = fVar231 * (fVar207 * fVar188 - fVar230 * fStack_580) * fVar208;
                fStack_52c = fVar231 * (fVar207 * (fVar167 * fStack_4cc +
                                                  fVar122 * fStack_45c +
                                                  fVar124 * fStack_46c + fVar189 * fStack_53c) -
                                       fVar230 * fStack_57c) * fVar208;
                local_558._4_4_ = local_508._4_4_;
                local_558._8_4_ = fStack_500;
                local_558._12_4_ = fStack_4fc;
                if (fVar207 < 0.0) {
                  local_5a8 = (float)local_588._0_4_ * fVar208;
                  fStack_5a4 = (float)local_588._4_4_ * fVar208;
                  fStack_5a0 = fStack_580 * fVar208;
                  fStack_59c = fStack_57c * fVar208;
                  local_598 = -(float)local_588._0_4_;
                  fStack_594 = -(float)local_588._4_4_;
                  fStack_590 = -fStack_580;
                  fStack_58c = -fStack_57c;
                  fVar207 = sqrtf(fVar207);
                  pRVar70 = extraout_RAX_01;
                  fVar122 = local_5a8;
                  fVar167 = fStack_5a4;
                  fVar169 = fStack_5a0;
                  fVar124 = fStack_59c;
                  fVar187 = (float)local_558._0_4_;
                  fVar188 = local_598;
                  fVar189 = fStack_594;
                  fVar208 = fStack_590;
                  fVar230 = fStack_58c;
                }
                else {
                  fVar207 = SQRT(fVar207);
                  fVar122 = (float)local_588._0_4_ * fVar208;
                  fVar167 = (float)local_588._4_4_ * fVar208;
                  fVar169 = fStack_580 * fVar208;
                  fVar124 = fStack_57c * fVar208;
                  fVar187 = (float)local_558._0_4_;
                  fVar188 = -(float)local_588._0_4_;
                  fVar189 = -(float)local_588._4_4_;
                  fVar208 = -fStack_580;
                  fVar230 = -fStack_57c;
                }
                fVar232 = fStack_4e4 * fVar167;
                fVar238 = fStack_4e0 * fVar169;
                fVar239 = fStack_4dc * fVar124;
                fVar231 = fVar232 + local_4e8 * fVar122 + fVar238;
                fVar242 = fVar232 + fVar232 + fVar239;
                fVar238 = fVar232 + fVar238 + fVar238;
                fVar239 = fVar232 + fVar239 + fVar239;
                fVar232 = (fVar206 + 1.0) * ((float)local_508._0_4_ / fVar207) +
                          fVar206 * (float)local_508._0_4_ + fVar187;
                fVar207 = fStack_4f0 * fVar169;
                fStack_52c = fStack_4ec * fVar124;
                fVar124 = fVar124 * fVar230;
                fVar206 = fVar169 * fVar208 + fVar167 * fVar189 + fVar122 * fVar188 +
                          fStack_530 * fStack_4e0 + fStack_534 * fStack_4e4 + local_538 * local_4e8;
                local_538 = fVar207 + fStack_4f4 * fVar167 + local_4f8 * fVar122;
                fVar167 = fVar152 - fVar231 * fVar231;
                auVar115._0_8_ = CONCAT44(fVar153 - fVar242 * fVar242,fVar167);
                auVar115._8_4_ = fVar127 - fVar238 * fVar238;
                auVar115._12_4_ = fVar151 - fVar239 * fVar239;
                fVar230 = fVar230 * fStack_4dc;
                fVar122 = (fVar208 * fStack_4e0 + fVar189 * fStack_4e4 + fVar188 * local_4e8) -
                          fVar231 * fVar206;
                local_378 = (fStack_4f0 * fStack_4e0 +
                            fStack_4f4 * fStack_4e4 + local_4f8 * local_4e8) - fVar231 * local_538;
                fStack_374 = fStack_4ec * fStack_4dc;
                fStack_370 = fStack_4f0 * fStack_4e0;
                fStack_36c = fStack_4ec * fStack_4dc;
                auVar181._8_4_ = auVar115._8_4_;
                auVar181._0_8_ = auVar115._0_8_;
                auVar181._12_4_ = auVar115._12_4_;
                auVar86 = rsqrtss(auVar181,auVar115);
                fVar188 = auVar86._0_4_;
                auVar182._4_12_ = auVar86._4_12_;
                auVar182._0_4_ = fVar188 * fVar188 * fVar167 * -0.5 * fVar188 + fVar188 * 1.5;
                fStack_534 = fStack_52c;
                fStack_530 = fVar207;
                if (fVar167 < 0.0) {
                  local_5a8 = fVar206;
                  fStack_5a4 = fVar124;
                  fStack_5a0 = fVar169 * fVar208;
                  fStack_59c = fVar124;
                  local_598 = fVar122;
                  fStack_594 = fVar230;
                  fStack_590 = fVar208 * fStack_4e0;
                  fStack_58c = fVar230;
                  local_568 = auVar182;
                  local_3a8 = fVar231;
                  fStack_3a4 = fVar242;
                  fStack_3a0 = fVar238;
                  fStack_39c = fVar239;
                  fVar167 = sqrtf(fVar167);
                  pRVar70 = extraout_RAX_02;
                  auVar182 = local_568;
                  fVar206 = local_5a8;
                  fVar124 = fStack_5a4;
                  fVar187 = (float)local_558._0_4_;
                  fVar231 = local_3a8;
                  fVar122 = local_598;
                  fVar230 = fStack_594;
                }
                else {
                  fVar167 = SQRT(fVar167);
                }
                auVar86 = _DAT_01fec6c0;
                auVar197._4_4_ = fVar153;
                auVar197._0_4_ = fVar152;
                auVar197._8_4_ = fVar127;
                auVar197._12_4_ = fVar151;
                fVar167 = fVar167 - fStack_50c;
                fVar122 = fVar122 * auVar182._0_4_ - fStack_57c;
                auVar38._4_4_ = fStack_374;
                auVar38._0_4_ = local_378;
                auVar38._8_4_ = fStack_370;
                auVar38._12_4_ = fStack_36c;
                auVar157._4_12_ = auVar38._4_12_;
                auVar157._0_4_ = local_378 * auVar182._0_4_;
                auVar307._0_8_ = CONCAT44(fVar230,fVar122) ^ 0x8000000080000000;
                auVar307._8_4_ = -fVar230;
                auVar307._12_4_ = fVar124;
                auVar306._8_8_ = auVar307._8_8_;
                auVar306._0_8_ = CONCAT44(fVar206,fVar122) ^ 0x80000000;
                fVar122 = fVar206 * auVar157._0_4_ - local_538 * fVar122;
                auVar159._0_8_ = auVar157._0_8_;
                auVar159._8_4_ = fStack_374;
                auVar159._12_4_ = -fStack_534;
                auVar158._8_8_ = auVar159._8_8_;
                auVar158._0_8_ = CONCAT44(local_538,auVar157._0_4_) ^ 0x8000000000000000;
                auVar26._4_4_ = fVar122;
                auVar26._0_4_ = fVar122;
                auVar26._8_4_ = fVar122;
                auVar26._12_4_ = fVar122;
                auVar155 = divps(auVar158,auVar26);
                auVar27._4_4_ = fVar122;
                auVar27._0_4_ = fVar122;
                auVar27._8_4_ = fVar122;
                auVar27._12_4_ = fVar122;
                auVar266 = divps(auVar306,auVar27);
                fVar168 = fVar168 - (auVar155._4_4_ * fVar167 + auVar155._0_4_ * fVar231);
                fVar84 = fVar84 - (auVar266._4_4_ * fVar167 + auVar266._0_4_ * fVar231);
                if ((fVar232 <= (float)((uint)fVar231 & (uint)DAT_01fec6c0)) ||
                   (local_3b8 * 1.9073486e-06 + fVar187 + fVar232 <=
                    (float)((uint)fVar167 & (uint)DAT_01fec6c0))) {
                  bVar23 = false;
                }
                else {
                  fVar84 = fVar84 + (float)local_2e8._0_4_;
                  bVar23 = true;
                  if (((((ray->super_RayK<1>).org.field_0.m128[3] <= fVar84) &&
                       (fVar122 = (ray->super_RayK<1>).tfar, fVar84 <= fVar122)) && (0.0 <= fVar168)
                      ) && (fVar168 <= 1.0)) {
                    auVar155 = rsqrtss(auVar197,auVar197);
                    fVar124 = auVar155._0_4_;
                    pGVar19 = (context->scene->geometries).items[(long)local_570].ptr;
                    uVar79 = (ray->super_RayK<1>).mask;
                    pRVar70 = (RayHit *)(ulong)uVar79;
                    pRVar72 = local_570;
                    if ((pGVar19->mask & uVar79) != 0) {
                      fVar124 = fVar124 * 1.5 + fVar124 * fVar124 * local_388 * -0.5 * fVar124;
                      fVar153 = local_4e8 * fVar124;
                      fVar169 = fStack_4e4 * fVar124;
                      fVar124 = fStack_4e0 * fVar124;
                      fVar151 = fStack_57c * fVar153 + (float)local_588._0_4_;
                      fVar127 = fStack_57c * fVar169 + (float)local_588._4_4_;
                      fVar152 = fStack_57c * fVar124 + fStack_580;
                      fVar167 = fVar169 * (float)local_588._0_4_ - (float)local_588._4_4_ * fVar153;
                      fVar169 = fVar124 * (float)local_588._4_4_ - fStack_580 * fVar169;
                      fVar153 = fVar153 * fStack_580 - (float)local_588._0_4_ * fVar124;
                      fVar124 = fVar127 * fVar169 - fVar153 * fVar151;
                      fVar127 = fVar152 * fVar153 - fVar167 * fVar127;
                      fVar151 = fVar151 * fVar167 - fVar169 * fVar152;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar19->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = fVar84;
                        *(ulong *)&(ray->Ng).field_0 = CONCAT44(fVar151,fVar127);
                        (ray->Ng).field_0.field_0.z = fVar124;
                        ray->u = fVar168;
                        ray->v = 0.0;
                        ray->primID = (uint)local_520;
                        ray->geomID = (uint)local_570;
                        ray->instID[0] = context->user->instID[0];
                        uVar79 = context->user->instPrimID[0];
                        ray->instPrimID[0] = uVar79;
                        pRVar70 = (RayHit *)(ulong)uVar79;
                      }
                      else {
                        local_458 = CONCAT44(fVar151,fVar127);
                        fStack_450 = fVar124;
                        fStack_44c = fVar168;
                        local_448 = 0;
                        local_444 = (uint)local_520;
                        local_440 = (uint)local_570;
                        local_43c = context->user->instID[0];
                        pRVar72 = (RTCIntersectArguments *)(ulong)local_43c;
                        local_438 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = fVar84;
                        local_5ac = 0xffffffff;
                        local_4c8.geometryUserPtr = pGVar19->userPtr;
                        local_4c8.valid = &local_5ac;
                        local_4c8.context = context->user;
                        local_4c8.hit = (RTCHitN *)&local_458;
                        local_4c8.N = 1;
                        local_4c8.ray = (RTCRayN *)ray;
                        if (pGVar19->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00bda12c:
                          pRVar72 = context->args;
                          if (pRVar72->filter != (RTCFilterFunctionN)0x0) {
                            if (((pRVar72->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                 RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar19->field_8).field_0x2 & 0x40) != 0)) {
                              (*pRVar72->filter)(&local_4c8);
                              auVar86 = _DAT_01fec6c0;
                            }
                            if ((((RayK<1> *)local_4c8.valid)->org).field_0.m128[0] == 0.0)
                            goto LAB_00bda1dd;
                          }
                          (((Vec3f *)((long)local_4c8.ray + 0x30))->field_0).field_0.x =
                               *(float *)local_4c8.hit;
                          (((Vec3f *)((long)local_4c8.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_4c8.hit + 4);
                          (((Vec3f *)((long)local_4c8.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_4c8.hit + 8);
                          *(float *)((long)local_4c8.ray + 0x3c) = *(float *)(local_4c8.hit + 0xc);
                          *(float *)((long)local_4c8.ray + 0x40) = *(float *)(local_4c8.hit + 0x10);
                          *(float *)((long)local_4c8.ray + 0x44) = *(float *)(local_4c8.hit + 0x14);
                          *(float *)((long)local_4c8.ray + 0x48) = *(float *)(local_4c8.hit + 0x18);
                          *(float *)((long)local_4c8.ray + 0x4c) = *(float *)(local_4c8.hit + 0x1c);
                          pRVar72 = (RTCIntersectArguments *)
                                    (ulong)(uint)*(float *)(local_4c8.hit + 0x20);
                          *(float *)((long)local_4c8.ray + 0x50) = *(float *)(local_4c8.hit + 0x20);
                          pRVar70 = (RayHit *)local_4c8.ray;
                        }
                        else {
                          (*pGVar19->intersectionFilterN)(&local_4c8);
                          auVar86 = _DAT_01fec6c0;
                          if ((((RayK<1> *)local_4c8.valid)->org).field_0.m128[0] != 0.0)
                          goto LAB_00bda12c;
LAB_00bda1dd:
                          (ray->super_RayK<1>).tfar = fVar122;
                          pRVar70 = (RayHit *)local_4c8.valid;
                        }
                      }
                    }
                  }
                }
                bVar78 = lVar77 == 0;
                lVar77 = lVar77 + -1;
                pRVar69 = (RayHit *)CONCAT71((int7)((ulong)pRVar70 >> 8),bVar78);
              } while ((!bVar23) && (!bVar78));
              fVar168 = (ray->super_RayK<1>).tfar;
              local_328._0_4_ = -(uint)(local_3e8 <= fVar168) & local_328._0_4_;
              local_328._4_4_ = -(uint)(fStack_3e4 <= fVar168) & local_328._4_4_;
              local_328._8_4_ = -(uint)(fStack_3e0 <= fVar168) & local_328._8_4_;
              local_328._12_4_ = -(uint)(fStack_3dc <= fVar168) & local_328._12_4_;
              uVar71 = (undefined4)((ulong)pRVar70 >> 0x20);
              iVar65 = movmskps((int)pRVar69,local_328);
            } while (iVar65 != 0);
          }
          fVar168 = (ray->super_RayK<1>).tfar;
          local_428._0_4_ = -(uint)((float)local_428._0_4_ + local_3c8 <= fVar168) & local_368._0_4_
          ;
          local_428._4_4_ =
               -(uint)((float)local_428._4_4_ + fStack_3c4 <= fVar168) & local_368._4_4_;
          fStack_420 = (float)(-(uint)(fStack_420 + fStack_3c0 <= fVar168) & (uint)fStack_360);
          fStack_41c = (float)(-(uint)(fStack_41c + fStack_3bc <= fVar168) & (uint)fStack_35c);
          local_418._0_4_ =
               -(uint)((int)local_318 <
                      ((int)((local_418._0_4_ & local_308._0_4_) << 0x1f) >> 0x1f) + 4);
          local_418._4_4_ =
               -(uint)((int)fStack_314 <
                      ((int)((local_418._4_4_ & local_308._4_4_) << 0x1f) >> 0x1f) + 4);
          fStack_410 = (float)-(uint)((int)fStack_310 <
                                     ((int)(((uint)fStack_410 & local_308._8_4_) << 0x1f) >> 0x1f) +
                                     4);
          fStack_40c = (float)-(uint)((int)fStack_30c <
                                     ((int)(((uint)fStack_40c & local_308._12_4_) << 0x1f) >> 0x1f)
                                     + 4);
          local_338 = ~_local_418 & _local_428;
          iVar65 = movmskps(iVar65,local_338);
          if (iVar65 != 0) {
            local_3d8 = _local_1d8;
            local_3e8 = local_3c8 + (float)local_1d8._0_4_;
            fStack_3e4 = fStack_3c4 + (float)local_1d8._4_4_;
            fStack_3e0 = fStack_3c0 + fStack_1d0;
            fStack_3dc = fStack_3bc + fStack_1cc;
            do {
              auVar266 = ~local_338 & _DAT_01feb9f0 | local_338 & local_3d8;
              auVar183._4_4_ = auVar266._0_4_;
              auVar183._0_4_ = auVar266._4_4_;
              auVar183._8_4_ = auVar266._12_4_;
              auVar183._12_4_ = auVar266._8_4_;
              auVar155 = minps(auVar183,auVar266);
              auVar147._0_8_ = auVar155._8_8_;
              auVar147._8_4_ = auVar155._0_4_;
              auVar147._12_4_ = auVar155._4_4_;
              auVar155 = minps(auVar147,auVar155);
              auVar148._0_8_ =
                   CONCAT44(-(uint)(auVar155._4_4_ == auVar266._4_4_) & local_338._4_4_,
                            -(uint)(auVar155._0_4_ == auVar266._0_4_) & local_338._0_4_);
              auVar148._8_4_ = -(uint)(auVar155._8_4_ == auVar266._8_4_) & local_338._8_4_;
              auVar148._12_4_ = -(uint)(auVar155._12_4_ == auVar266._12_4_) & local_338._12_4_;
              iVar65 = movmskps(iVar65,auVar148);
              auVar116 = local_338;
              if (iVar65 != 0) {
                auVar116._8_4_ = auVar148._8_4_;
                auVar116._0_8_ = auVar148._0_8_;
                auVar116._12_4_ = auVar148._12_4_;
              }
              uVar66 = movmskps(iVar65,auVar116);
              pRVar69 = (RayHit *)0x0;
              if (CONCAT44(uVar71,uVar66) != 0) {
                for (; (CONCAT44(uVar71,uVar66) >> (long)pRVar69 & 1) == 0;
                    pRVar69 = (RayHit *)((long)(pRVar69->super_RayK<1>).org.field_0.m128 + 1)) {
                }
              }
              *(undefined4 *)(local_338 + (long)pRVar69 * 4) = 0;
              fVar168 = local_2d8[(long)pRVar69];
              fVar84 = *(float *)(local_1c8 + (long)pRVar69 * 4);
              local_4f8 = (ray->super_RayK<1>).dir.field_0.m128[0];
              fStack_4f4 = (ray->super_RayK<1>).dir.field_0.m128[1];
              fStack_4f0 = (ray->super_RayK<1>).dir.field_0.m128[2];
              fStack_4ec = (ray->super_RayK<1>).dir.field_0.m128[3];
              fVar122 = fStack_4f0 * fStack_4f0 + fStack_4f4 * fStack_4f4 + local_4f8 * local_4f8;
              if (fVar122 < 0.0) {
                fVar122 = sqrtf(fVar122);
                pRVar69 = extraout_RAX_03;
                auVar86 = _DAT_01fec6c0;
              }
              else {
                fVar122 = SQRT(fVar122);
              }
              auVar33._4_4_ = fStack_4d4;
              auVar33._0_4_ = local_4d8;
              auVar33._8_4_ = fStack_4d0;
              auVar33._12_4_ = fStack_4cc;
              auVar37._4_4_ = fStack_464;
              auVar37._0_4_ = local_468;
              auVar37._8_4_ = fStack_460;
              auVar37._12_4_ = fStack_45c;
              auVar266 = minps(auVar33,auVar37);
              auVar156 = maxps(auVar33,auVar37);
              auVar35._4_4_ = fStack_474;
              auVar35._0_4_ = local_478;
              auVar35._8_4_ = fStack_470;
              auVar35._12_4_ = fStack_46c;
              auVar155 = minps(auVar35,_local_548);
              auVar266 = minps(auVar266,auVar155);
              auVar155 = maxps(auVar35,_local_548);
              auVar155 = maxps(auVar156,auVar155);
              auVar198._0_4_ = auVar266._0_4_ & auVar86._0_4_;
              auVar198._4_4_ = auVar266._4_4_ & auVar86._4_4_;
              auVar198._8_4_ = auVar266._8_4_ & auVar86._8_4_;
              auVar198._12_4_ = auVar266._12_4_ & auVar86._12_4_;
              local_3b8 = auVar155._12_4_;
              auVar117._0_4_ = auVar155._0_4_ & auVar86._0_4_;
              auVar117._4_4_ = auVar155._4_4_ & auVar86._4_4_;
              auVar117._8_4_ = auVar155._8_4_ & auVar86._8_4_;
              auVar117._12_4_ = (uint)local_3b8 & auVar86._12_4_;
              auVar86 = maxps(auVar198,auVar117);
              fVar124 = auVar86._4_4_;
              if (auVar86._4_4_ <= auVar86._0_4_) {
                fVar124 = auVar86._0_4_;
              }
              auVar199._8_8_ = auVar86._8_8_;
              auVar199._0_8_ = auVar86._8_8_;
              if (auVar86._8_4_ <= fVar124) {
                auVar199._0_4_ = fVar124;
              }
              register0x00001304 = auVar199._4_12_;
              local_508._0_4_ = auVar199._0_4_ * 1.9073486e-06;
              local_398 = fVar122 * 1.9073486e-06;
              fStack_3b4 = local_3b8;
              fStack_3b0 = local_3b8;
              fStack_3ac = local_3b8;
              lVar77 = 4;
              do {
                fVar167 = 1.0 - fVar168;
                local_558 = ZEXT416((uint)fVar167);
                local_588._4_4_ = fVar168 * fVar167;
                fVar152 = fVar167 * fVar167 * fVar167;
                local_588._0_4_ = fVar167 * fVar167;
                fStack_580 = fVar167 * 0.0;
                fStack_57c = fVar167 * 0.0;
                fVar122 = fVar168 * fVar168;
                fVar169 = (float)local_588._4_4_ * fVar168;
                fVar124 = fVar168 * fVar122;
                fVar151 = (fVar169 * 12.0 + fVar167 * (float)local_588._4_4_ * 6.0 +
                          fVar124 * 4.0 + fVar152) * 0.16666667;
                fVar127 = fVar124 * 0.16666667;
                fVar153 = fVar152 * 0.16666667;
                fVar124 = (fVar167 * (float)local_588._4_4_ * 12.0 + fVar169 * 6.0 +
                          fVar152 * 4.0 + fVar124) * 0.16666667;
                local_518._0_4_ =
                     fVar153 * local_4d8 +
                     fVar124 * local_468 + fVar151 * local_478 + fVar127 * (float)local_548._0_4_;
                local_518._4_4_ =
                     fVar153 * fStack_4d4 +
                     fVar124 * fStack_464 + fVar151 * fStack_474 + fVar127 * (float)local_548._4_4_;
                fStack_510 = fVar153 * fStack_4d0 +
                             fVar124 * fStack_460 + fVar151 * fStack_470 + fVar127 * fStack_540;
                fStack_50c = fVar153 * fStack_4cc +
                             fVar124 * fStack_45c + fVar151 * fStack_46c + fVar127 * fStack_53c;
                local_4e8 = (fVar84 * local_4f8 + 0.0) - (float)local_518._0_4_;
                fStack_4e4 = (fVar84 * fStack_4f4 + 0.0) - (float)local_518._4_4_;
                fStack_4e0 = (fVar84 * fStack_4f0 + 0.0) - fStack_510;
                fStack_4dc = (fVar84 * fStack_4ec + 0.0) - fStack_50c;
                fVar124 = fStack_4e4 * fStack_4e4;
                fVar127 = fStack_4e0 * fStack_4e0;
                fVar151 = fStack_4dc * fStack_4dc;
                fVar152 = fVar124 + local_4e8 * local_4e8 + fVar127;
                fVar153 = fVar124 + fVar124 + fVar151;
                fVar127 = fVar124 + fVar127 + fVar127;
                fVar151 = fVar124 + fVar151 + fVar151;
                local_388 = fVar152;
                if (fVar152 < 0.0) {
                  local_5a8 = fVar122;
                  fStack_5a4 = fVar169;
                  fStack_5a0 = fVar167 * 0.0 * fVar168;
                  fStack_59c = fVar167 * 0.0 * fVar168;
                  local_598 = fVar168;
                  fStack_594 = fVar168;
                  fStack_590 = fVar168;
                  fStack_58c = fVar168;
                  fVar206 = sqrtf(fVar152);
                  fVar124 = local_558._0_4_;
                  pRVar70 = extraout_RAX_04;
                  fVar122 = local_5a8;
                  fVar169 = local_598;
                  fVar187 = fStack_594;
                  fVar188 = fStack_590;
                  fVar189 = fStack_58c;
                }
                else {
                  fVar206 = SQRT(fVar152);
                  pRVar70 = pRVar69;
                  fVar169 = fVar168;
                  fVar187 = fVar168;
                  fVar188 = fVar168;
                  fVar189 = fVar168;
                  fVar124 = fVar167;
                }
                fVar230 = -fVar124 * fVar124 * 0.5;
                fVar207 = (-fVar168 * fVar168 - (float)local_588._4_4_ * 4.0) * 0.5;
                fVar208 = (fVar124 * fVar124 + (float)local_588._4_4_ * 4.0) * 0.5;
                fVar122 = fVar122 * 0.5;
                local_588._0_4_ =
                     fVar230 * local_4d8 +
                     fVar207 * local_468 + fVar208 * local_478 + fVar122 * (float)local_548._0_4_;
                local_588._4_4_ =
                     fVar230 * fStack_4d4 +
                     fVar207 * fStack_464 + fVar208 * fStack_474 + fVar122 * (float)local_548._4_4_;
                fStack_580 = fVar230 * fStack_4d0 +
                             fVar207 * fStack_460 + fVar208 * fStack_470 + fVar122 * fStack_540;
                fStack_57c = fVar230 * fStack_4cc +
                             fVar207 * fStack_45c + fVar208 * fStack_46c + fVar122 * fStack_53c;
                fVar122 = fVar168 - (fVar124 + fVar124);
                fVar124 = fVar124 - (fVar168 + fVar168);
                fVar169 = fVar167 * local_4d8 +
                          fVar122 * local_468 +
                          fVar124 * local_478 + fVar169 * (float)local_548._0_4_;
                fVar187 = fVar167 * fStack_4d4 +
                          fVar122 * fStack_464 +
                          fVar124 * fStack_474 + fVar187 * (float)local_548._4_4_;
                fVar188 = fVar167 * fStack_4d0 +
                          fVar122 * fStack_460 + fVar124 * fStack_470 + fVar188 * fStack_540;
                local_558._0_4_ = local_508._0_4_;
                if ((float)local_508._0_4_ <= local_398 * fVar84) {
                  local_558._0_4_ = local_398 * fVar84;
                }
                fVar207 = (float)local_588._4_4_ * (float)local_588._4_4_ +
                          (float)local_588._0_4_ * (float)local_588._0_4_ + fStack_580 * fStack_580;
                auVar155 = ZEXT416((uint)fVar207);
                auVar86 = rsqrtss(ZEXT416((uint)fVar207),auVar155);
                fVar208 = auVar86._0_4_;
                fVar208 = fVar208 * fVar208 * fVar207 * -0.5 * fVar208 + fVar208 * 1.5;
                fVar230 = fVar188 * fStack_580 +
                          fVar187 * (float)local_588._4_4_ + fVar169 * (float)local_588._0_4_;
                auVar86 = rcpss(auVar155,auVar155);
                fVar231 = (2.0 - fVar207 * auVar86._0_4_) * auVar86._0_4_;
                local_538 = fVar231 * (fVar207 * fVar169 - fVar230 * (float)local_588._0_4_) *
                            fVar208;
                fStack_534 = fVar231 * (fVar207 * fVar187 - fVar230 * (float)local_588._4_4_) *
                             fVar208;
                fStack_530 = fVar231 * (fVar207 * fVar188 - fVar230 * fStack_580) * fVar208;
                fStack_52c = fVar231 * (fVar207 * (fVar167 * fStack_4cc +
                                                  fVar122 * fStack_45c +
                                                  fVar124 * fStack_46c + fVar189 * fStack_53c) -
                                       fVar230 * fStack_57c) * fVar208;
                local_558._4_4_ = local_508._4_4_;
                local_558._8_4_ = fStack_500;
                local_558._12_4_ = fStack_4fc;
                if (fVar207 < 0.0) {
                  local_5a8 = (float)local_588._0_4_ * fVar208;
                  fStack_5a4 = (float)local_588._4_4_ * fVar208;
                  fStack_5a0 = fStack_580 * fVar208;
                  fStack_59c = fStack_57c * fVar208;
                  local_598 = -(float)local_588._0_4_;
                  fStack_594 = -(float)local_588._4_4_;
                  fStack_590 = -fStack_580;
                  fStack_58c = -fStack_57c;
                  fVar207 = sqrtf(fVar207);
                  pRVar70 = extraout_RAX_05;
                  fVar122 = local_5a8;
                  fVar167 = fStack_5a4;
                  fVar169 = fStack_5a0;
                  fVar124 = fStack_59c;
                  fVar187 = (float)local_558._0_4_;
                  fVar188 = local_598;
                  fVar189 = fStack_594;
                  fVar208 = fStack_590;
                  fVar230 = fStack_58c;
                }
                else {
                  fVar207 = SQRT(fVar207);
                  fVar122 = (float)local_588._0_4_ * fVar208;
                  fVar167 = (float)local_588._4_4_ * fVar208;
                  fVar169 = fStack_580 * fVar208;
                  fVar124 = fStack_57c * fVar208;
                  fVar187 = (float)local_558._0_4_;
                  fVar188 = -(float)local_588._0_4_;
                  fVar189 = -(float)local_588._4_4_;
                  fVar208 = -fStack_580;
                  fVar230 = -fStack_57c;
                }
                fVar232 = fStack_4e4 * fVar167;
                fVar238 = fStack_4e0 * fVar169;
                fVar239 = fStack_4dc * fVar124;
                fVar231 = fVar232 + local_4e8 * fVar122 + fVar238;
                fVar242 = fVar232 + fVar232 + fVar239;
                fVar238 = fVar232 + fVar238 + fVar238;
                fVar239 = fVar232 + fVar239 + fVar239;
                fVar232 = (fVar206 + 1.0) * ((float)local_508._0_4_ / fVar207) +
                          fVar206 * (float)local_508._0_4_ + fVar187;
                fVar207 = fStack_4f0 * fVar169;
                fStack_52c = fStack_4ec * fVar124;
                fVar124 = fVar124 * fVar230;
                fVar206 = fVar169 * fVar208 + fVar167 * fVar189 + fVar122 * fVar188 +
                          fStack_530 * fStack_4e0 + fStack_534 * fStack_4e4 + local_538 * local_4e8;
                local_538 = fVar207 + fStack_4f4 * fVar167 + local_4f8 * fVar122;
                fVar167 = fVar152 - fVar231 * fVar231;
                auVar118._0_8_ = CONCAT44(fVar153 - fVar242 * fVar242,fVar167);
                auVar118._8_4_ = fVar127 - fVar238 * fVar238;
                auVar118._12_4_ = fVar151 - fVar239 * fVar239;
                fVar230 = fVar230 * fStack_4dc;
                fVar122 = (fVar208 * fStack_4e0 + fVar189 * fStack_4e4 + fVar188 * local_4e8) -
                          fVar231 * fVar206;
                local_378 = (fStack_4f0 * fStack_4e0 +
                            fStack_4f4 * fStack_4e4 + local_4f8 * local_4e8) - fVar231 * local_538;
                fStack_374 = fStack_4ec * fStack_4dc;
                fStack_370 = fStack_4f0 * fStack_4e0;
                fStack_36c = fStack_4ec * fStack_4dc;
                auVar184._8_4_ = auVar118._8_4_;
                auVar184._0_8_ = auVar118._0_8_;
                auVar184._12_4_ = auVar118._12_4_;
                auVar86 = rsqrtss(auVar184,auVar118);
                fVar188 = auVar86._0_4_;
                auVar185._4_12_ = auVar86._4_12_;
                auVar185._0_4_ = fVar188 * fVar188 * fVar167 * -0.5 * fVar188 + fVar188 * 1.5;
                fStack_534 = fStack_52c;
                fStack_530 = fVar207;
                if (fVar167 < 0.0) {
                  local_5a8 = fVar206;
                  fStack_5a4 = fVar124;
                  fStack_5a0 = fVar169 * fVar208;
                  fStack_59c = fVar124;
                  local_598 = fVar122;
                  fStack_594 = fVar230;
                  fStack_590 = fVar208 * fStack_4e0;
                  fStack_58c = fVar230;
                  local_568 = auVar185;
                  local_3a8 = fVar231;
                  fStack_3a4 = fVar242;
                  fStack_3a0 = fVar238;
                  fStack_39c = fVar239;
                  fVar167 = sqrtf(fVar167);
                  pRVar70 = extraout_RAX_06;
                  auVar185 = local_568;
                  fVar206 = local_5a8;
                  fVar124 = fStack_5a4;
                  fVar187 = (float)local_558._0_4_;
                  fVar231 = local_3a8;
                  fVar122 = local_598;
                  fVar230 = fStack_594;
                }
                else {
                  fVar167 = SQRT(fVar167);
                }
                auVar86 = _DAT_01fec6c0;
                auVar200._4_4_ = fVar153;
                auVar200._0_4_ = fVar152;
                auVar200._8_4_ = fVar127;
                auVar200._12_4_ = fVar151;
                fVar167 = fVar167 - fStack_50c;
                fVar122 = fVar122 * auVar185._0_4_ - fStack_57c;
                auVar39._4_4_ = fStack_374;
                auVar39._0_4_ = local_378;
                auVar39._8_4_ = fStack_370;
                auVar39._12_4_ = fStack_36c;
                auVar160._4_12_ = auVar39._4_12_;
                auVar160._0_4_ = local_378 * auVar185._0_4_;
                auVar309._0_8_ = CONCAT44(fVar230,fVar122) ^ 0x8000000080000000;
                auVar309._8_4_ = -fVar230;
                auVar309._12_4_ = fVar124;
                auVar308._8_8_ = auVar309._8_8_;
                auVar308._0_8_ = CONCAT44(fVar206,fVar122) ^ 0x80000000;
                fVar122 = fVar206 * auVar160._0_4_ - local_538 * fVar122;
                auVar162._0_8_ = auVar160._0_8_;
                auVar162._8_4_ = fStack_374;
                auVar162._12_4_ = -fStack_534;
                auVar161._8_8_ = auVar162._8_8_;
                auVar161._0_8_ = CONCAT44(local_538,auVar160._0_4_) ^ 0x8000000000000000;
                auVar28._4_4_ = fVar122;
                auVar28._0_4_ = fVar122;
                auVar28._8_4_ = fVar122;
                auVar28._12_4_ = fVar122;
                auVar155 = divps(auVar161,auVar28);
                auVar29._4_4_ = fVar122;
                auVar29._0_4_ = fVar122;
                auVar29._8_4_ = fVar122;
                auVar29._12_4_ = fVar122;
                auVar266 = divps(auVar308,auVar29);
                fVar168 = fVar168 - (auVar155._4_4_ * fVar167 + auVar155._0_4_ * fVar231);
                fVar84 = fVar84 - (auVar266._4_4_ * fVar167 + auVar266._0_4_ * fVar231);
                if ((fVar232 <= (float)((uint)fVar231 & (uint)DAT_01fec6c0)) ||
                   (local_3b8 * 1.9073486e-06 + fVar187 + fVar232 <=
                    (float)((uint)fVar167 & (uint)DAT_01fec6c0))) {
                  bVar23 = false;
                }
                else {
                  fVar84 = fVar84 + (float)local_2e8._0_4_;
                  bVar23 = true;
                  if (((((ray->super_RayK<1>).org.field_0.m128[3] <= fVar84) &&
                       (fVar122 = (ray->super_RayK<1>).tfar, fVar84 <= fVar122)) && (0.0 <= fVar168)
                      ) && (fVar168 <= 1.0)) {
                    auVar155 = rsqrtss(auVar200,auVar200);
                    fVar124 = auVar155._0_4_;
                    pGVar19 = (context->scene->geometries).items[(long)local_570].ptr;
                    uVar79 = (ray->super_RayK<1>).mask;
                    pRVar70 = (RayHit *)(ulong)uVar79;
                    pRVar72 = local_570;
                    if ((pGVar19->mask & uVar79) != 0) {
                      fVar124 = fVar124 * 1.5 + fVar124 * fVar124 * local_388 * -0.5 * fVar124;
                      fVar153 = local_4e8 * fVar124;
                      fVar169 = fStack_4e4 * fVar124;
                      fVar124 = fStack_4e0 * fVar124;
                      fVar151 = fStack_57c * fVar153 + (float)local_588._0_4_;
                      fVar127 = fStack_57c * fVar169 + (float)local_588._4_4_;
                      fVar152 = fStack_57c * fVar124 + fStack_580;
                      fVar167 = fVar169 * (float)local_588._0_4_ - (float)local_588._4_4_ * fVar153;
                      fVar169 = fVar124 * (float)local_588._4_4_ - fStack_580 * fVar169;
                      fVar153 = fVar153 * fStack_580 - (float)local_588._0_4_ * fVar124;
                      fVar124 = fVar127 * fVar169 - fVar153 * fVar151;
                      fVar127 = fVar152 * fVar153 - fVar167 * fVar127;
                      fVar151 = fVar151 * fVar167 - fVar169 * fVar152;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar19->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = fVar84;
                        *(ulong *)&(ray->Ng).field_0 = CONCAT44(fVar151,fVar127);
                        (ray->Ng).field_0.field_0.z = fVar124;
                        ray->u = fVar168;
                        ray->v = 0.0;
                        ray->primID = (uint)local_520;
                        ray->geomID = (uint)local_570;
                        ray->instID[0] = context->user->instID[0];
                        uVar79 = context->user->instPrimID[0];
                        ray->instPrimID[0] = uVar79;
                        pRVar70 = (RayHit *)(ulong)uVar79;
                      }
                      else {
                        local_458 = CONCAT44(fVar151,fVar127);
                        fStack_450 = fVar124;
                        fStack_44c = fVar168;
                        local_448 = 0;
                        local_444 = (uint)local_520;
                        local_440 = (uint)local_570;
                        local_43c = context->user->instID[0];
                        pRVar72 = (RTCIntersectArguments *)(ulong)local_43c;
                        local_438 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = fVar84;
                        local_5ac = 0xffffffff;
                        local_4c8.geometryUserPtr = pGVar19->userPtr;
                        local_4c8.valid = &local_5ac;
                        local_4c8.context = context->user;
                        local_4c8.hit = (RTCHitN *)&local_458;
                        local_4c8.N = 1;
                        local_4c8.ray = (RTCRayN *)ray;
                        if (pGVar19->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00bdacd7:
                          pRVar72 = context->args;
                          if (pRVar72->filter != (RTCFilterFunctionN)0x0) {
                            if (((pRVar72->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                 RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar19->field_8).field_0x2 & 0x40) != 0)) {
                              (*pRVar72->filter)(&local_4c8);
                              auVar86 = _DAT_01fec6c0;
                            }
                            if ((((RayK<1> *)local_4c8.valid)->org).field_0.m128[0] == 0.0)
                            goto LAB_00bdad88;
                          }
                          (((Vec3f *)((long)local_4c8.ray + 0x30))->field_0).field_0.x =
                               *(float *)local_4c8.hit;
                          (((Vec3f *)((long)local_4c8.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_4c8.hit + 4);
                          (((Vec3f *)((long)local_4c8.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_4c8.hit + 8);
                          *(float *)((long)local_4c8.ray + 0x3c) = *(float *)(local_4c8.hit + 0xc);
                          *(float *)((long)local_4c8.ray + 0x40) = *(float *)(local_4c8.hit + 0x10);
                          *(float *)((long)local_4c8.ray + 0x44) = *(float *)(local_4c8.hit + 0x14);
                          *(float *)((long)local_4c8.ray + 0x48) = *(float *)(local_4c8.hit + 0x18);
                          *(float *)((long)local_4c8.ray + 0x4c) = *(float *)(local_4c8.hit + 0x1c);
                          pRVar72 = (RTCIntersectArguments *)
                                    (ulong)(uint)*(float *)(local_4c8.hit + 0x20);
                          *(float *)((long)local_4c8.ray + 0x50) = *(float *)(local_4c8.hit + 0x20);
                          pRVar70 = (RayHit *)local_4c8.ray;
                        }
                        else {
                          (*pGVar19->intersectionFilterN)(&local_4c8);
                          auVar86 = _DAT_01fec6c0;
                          if ((((RayK<1> *)local_4c8.valid)->org).field_0.m128[0] != 0.0)
                          goto LAB_00bdacd7;
LAB_00bdad88:
                          (ray->super_RayK<1>).tfar = fVar122;
                          pRVar70 = (RayHit *)local_4c8.valid;
                        }
                      }
                    }
                  }
                }
                bVar78 = lVar77 == 0;
                lVar77 = lVar77 + -1;
                pRVar69 = (RayHit *)CONCAT71((int7)((ulong)pRVar70 >> 8),bVar78);
              } while ((!bVar23) && (!bVar78));
              fVar168 = (ray->super_RayK<1>).tfar;
              local_338._0_4_ = -(uint)(local_3e8 <= fVar168) & local_338._0_4_;
              local_338._4_4_ = -(uint)(fStack_3e4 <= fVar168) & local_338._4_4_;
              local_338._8_4_ = -(uint)(fStack_3e0 <= fVar168) & local_338._8_4_;
              local_338._12_4_ = -(uint)(fStack_3dc <= fVar168) & local_338._12_4_;
              uVar71 = (undefined4)((ulong)pRVar70 >> 0x20);
              iVar65 = movmskps((int)pRVar69,local_338);
            } while (iVar65 != 0);
          }
          fVar168 = (ray->super_RayK<1>).tfar;
          auVar201._0_4_ =
               local_488._0_4_ & local_2f8._0_4_ &
               -(uint)(local_3c8 + (float)local_118._0_4_ <= fVar168);
          auVar201._4_4_ =
               local_488._4_4_ & local_2f8._4_4_ &
               -(uint)(fStack_3c4 + (float)local_118._4_4_ <= fVar168);
          auVar201._8_4_ =
               (uint)fStack_480 & (uint)fStack_2f0 & -(uint)(fStack_3c0 + fStack_110 <= fVar168);
          auVar201._12_4_ =
               (uint)fStack_47c & (uint)fStack_2ec & -(uint)(fStack_3bc + fStack_10c <= fVar168);
          auVar163._0_4_ =
               local_418._0_4_ & local_428._0_4_ &
               -(uint)(local_3c8 + (float)local_1d8._0_4_ <= fVar168);
          auVar163._4_4_ =
               local_418._4_4_ & local_428._4_4_ &
               -(uint)(fStack_3c4 + (float)local_1d8._4_4_ <= fVar168);
          auVar163._8_4_ =
               (uint)fStack_410 & (uint)fStack_420 & -(uint)(fStack_3c0 + fStack_1d0 <= fVar168);
          auVar163._12_4_ =
               (uint)fStack_40c & (uint)fStack_41c & -(uint)(fStack_3bc + fStack_1cc <= fVar168);
          iVar65 = movmskps(iVar65,auVar163 | auVar201);
          if (iVar65 != 0) {
            *(undefined1 (*) [16])(auStack_f8 + uVar73 * 0xc) = auVar163 | auVar201;
            auVar119._0_4_ = local_118._0_4_ & auVar201._0_4_;
            auVar119._4_4_ = local_118._4_4_ & auVar201._4_4_;
            auVar119._8_4_ = (uint)fStack_110 & auVar201._8_4_;
            auVar119._12_4_ = (uint)fStack_10c & auVar201._12_4_;
            auVar202._0_4_ = ~auVar201._0_4_ & local_1d8._0_4_;
            auVar202._4_4_ = ~auVar201._4_4_ & local_1d8._4_4_;
            auVar202._8_4_ = ~auVar201._8_4_ & (uint)fStack_1d0;
            auVar202._12_4_ = ~auVar201._12_4_ & (uint)fStack_1cc;
            *(undefined1 (*) [16])(afStack_e8 + uVar73 * 0xc) = auVar202 | auVar119;
            afStack_d0[uVar73 * 0xc + -2] = local_408;
            afStack_d0[uVar73 * 0xc + -1] = fStack_404;
            fVar168 = (float)((int)local_490 + 1);
            pRVar72 = (RTCIntersectArguments *)(ulong)(uint)fVar168;
            afStack_d0[uVar73 * 0xc] = fVar168;
            uVar68 = (ulong)((int)uVar73 + 1);
          }
        }
      }
    }
    fVar122 = (ray->super_RayK<1>).tfar;
    fVar168 = local_408;
    fVar84 = fStack_404;
    uVar71 = uStack_400;
    uVar66 = uStack_3fc;
    do {
      uVar79 = (uint)uVar68;
      if (uVar79 == 0) {
        fVar168 = (ray->super_RayK<1>).tfar;
        auVar150._4_4_ = -(uint)(fStack_1b4 <= fVar168);
        auVar150._0_4_ = -(uint)(local_1b8 <= fVar168);
        auVar150._8_4_ = -(uint)(fStack_1b0 <= fVar168);
        auVar150._12_4_ = -(uint)(fStack_1ac <= fVar168);
        uVar79 = movmskps((int)pRVar72,auVar150);
        uVar79 = (uint)local_2b0 - 1 & (uint)local_2b0 & uVar79;
        if (uVar79 == 0) {
          return;
        }
        goto LAB_00bd8559;
      }
      uVar68 = (ulong)(uVar79 - 1);
      local_4c8.valid._0_4_ =
           -(uint)(local_3c8 + afStack_e8[uVar68 * 0xc] <= fVar122) & auStack_f8[uVar68 * 0xc];
      local_4c8.valid._4_4_ =
           -(uint)(fStack_3c4 + afStack_e8[uVar68 * 0xc + 1] <= fVar122) &
           auStack_f8[uVar68 * 0xc + 1];
      local_4c8.geometryUserPtr._0_4_ =
           -(uint)(fStack_3c0 + afStack_e8[uVar68 * 0xc + 2] <= fVar122) &
           auStack_f8[uVar68 * 0xc + 2];
      local_4c8.geometryUserPtr._4_4_ =
           -(uint)(fStack_3bc + afStack_e8[uVar68 * 0xc + 3] <= fVar122) &
           (uint)afStack_e8[uVar68 * 0xc + -1];
      uVar80 = movmskps((int)pRVar72,(undefined1  [16])local_4c8._0_16_);
      pRVar72 = (RTCIntersectArguments *)(ulong)uVar80;
      if (uVar80 != 0) {
        auVar164._0_4_ = (uint)afStack_e8[uVar68 * 0xc] & (uint)local_4c8.valid;
        auVar164._4_4_ = (uint)afStack_e8[uVar68 * 0xc + 1] & local_4c8.valid._4_4_;
        auVar164._8_4_ = (uint)afStack_e8[uVar68 * 0xc + 2] & (uint)local_4c8.geometryUserPtr;
        auVar164._12_4_ = (uint)afStack_e8[uVar68 * 0xc + 3] & local_4c8.geometryUserPtr._4_4_;
        auVar186._0_8_ =
             CONCAT44(~local_4c8.valid._4_4_,~(uint)local_4c8.valid) & 0x7f8000007f800000;
        auVar186._8_4_ = ~(uint)local_4c8.geometryUserPtr & 0x7f800000;
        auVar186._12_4_ = ~local_4c8.geometryUserPtr._4_4_ & 0x7f800000;
        auVar186 = auVar186 | auVar164;
        auVar203._4_4_ = auVar186._0_4_;
        auVar203._0_4_ = auVar186._4_4_;
        auVar203._8_4_ = auVar186._12_4_;
        auVar203._12_4_ = auVar186._8_4_;
        auVar155 = minps(auVar203,auVar186);
        auVar165._0_8_ = auVar155._8_8_;
        auVar165._8_4_ = auVar155._0_4_;
        auVar165._12_4_ = auVar155._4_4_;
        auVar155 = minps(auVar165,auVar155);
        auVar166._0_8_ =
             CONCAT44(-(uint)(auVar155._4_4_ == auVar186._4_4_) & local_4c8.valid._4_4_,
                      -(uint)(auVar155._0_4_ == auVar186._0_4_) & (uint)local_4c8.valid);
        auVar166._8_4_ = -(uint)(auVar155._8_4_ == auVar186._8_4_) & (uint)local_4c8.geometryUserPtr
        ;
        auVar166._12_4_ =
             -(uint)(auVar155._12_4_ == auVar186._12_4_) & local_4c8.geometryUserPtr._4_4_;
        iVar65 = movmskps((int)lVar74,auVar166);
        auVar149 = (undefined1  [16])local_4c8._0_16_;
        if (iVar65 != 0) {
          auVar149._8_4_ = auVar166._8_4_;
          auVar149._0_8_ = auVar166._0_8_;
          auVar149._12_4_ = auVar166._12_4_;
        }
        fVar168 = afStack_d0[uVar68 * 0xc + -2];
        fVar84 = afStack_d0[uVar68 * 0xc + -1];
        local_490 = (ulong)(uint)afStack_d0[uVar68 * 0xc];
        uVar81 = movmskps(afStack_d0[uVar68 * 0xc],auVar149);
        lVar74 = 0;
        if (uVar81 != 0) {
          for (; (uVar81 >> lVar74 & 1) == 0; lVar74 = lVar74 + 1) {
          }
        }
        *(undefined4 *)((long)&local_4c8.valid + lVar74 * 4) = 0;
        *(undefined1 (*) [16])(auStack_f8 + uVar68 * 0xc) = (undefined1  [16])local_4c8._0_16_;
        iVar65 = movmskps((int)(undefined1 (*) [16])(auStack_f8 + uVar68 * 0xc),
                          (undefined1  [16])local_4c8._0_16_);
        if (iVar65 == 0) {
          uVar79 = uVar79 - 1;
        }
        fVar84 = fVar84 - fVar168;
        local_458 = CONCAT44(fVar84 * 0.33333334 + fVar168,fVar84 * 0.0 + fVar168);
        fStack_450 = fVar84 * 0.6666667 + fVar168;
        fStack_44c = fVar84 * 1.0 + fVar168;
        fVar168 = *(float *)((long)&local_458 + lVar74 * 4);
        fVar84 = *(float *)((long)&local_458 + lVar74 * 4 + 4);
        uVar71 = 0;
        uVar66 = 0;
        uVar68 = (ulong)uVar79;
      }
      uVar73 = uVar68;
    } while ((char)uVar80 == '\0');
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }